

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [12];
  Primitive *pPVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Primitive PVar14;
  undefined4 uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  long lVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined3 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined6 uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  byte bVar53;
  ulong uVar54;
  ulong uVar55;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar56;
  long lVar57;
  ulong uVar58;
  long lVar59;
  ulong uVar60;
  bool bVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  int iVar65;
  uint uVar66;
  uint uVar67;
  short sVar68;
  undefined2 uVar106;
  float fVar69;
  float fVar107;
  float fVar108;
  vfloat_impl<4> p00;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  float fVar109;
  float fVar133;
  float fVar134;
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar135;
  float fVar147;
  float fVar148;
  vfloat4 v;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar149;
  undefined8 uVar150;
  float fVar159;
  vfloat4 v_1;
  float fVar158;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar160;
  float fVar161;
  float fVar173;
  float fVar176;
  vfloat4 a;
  float fVar174;
  float fVar175;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar181;
  float fVar182;
  float fVar208;
  float fVar210;
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  float fVar209;
  float fVar211;
  float fVar212;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar213;
  float fVar216;
  float fVar217;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar218;
  float fVar219;
  float fVar232;
  float fVar234;
  vfloat4 a_2;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  float fVar233;
  float fVar235;
  float fVar236;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar237;
  float fVar246;
  float fVar247;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar248;
  float fVar249;
  float fVar261;
  float fVar263;
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  float fVar262;
  float fVar264;
  float fVar265;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar278;
  float fVar281;
  vfloat4 a_1;
  undefined1 auVar269 [16];
  undefined1 auVar272 [16];
  float fVar279;
  float fVar280;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar286;
  float fVar287;
  float fVar297;
  float fVar299;
  vfloat4 a_3;
  float fVar301;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar292 [16];
  float fVar298;
  float fVar300;
  float fVar302;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar303;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3cc;
  float fStack_3bc;
  undefined8 local_3b8;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  ulong local_310;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  Primitive *local_280;
  RTCFilterFunctionNArguments local_278;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  float afStack_1e8 [4];
  undefined8 local_1d8;
  float local_1d0;
  float local_1cc;
  float fStack_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar103 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 uVar105;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  
  PVar14 = prim[1];
  uVar54 = (ulong)(byte)PVar14;
  lVar59 = uVar54 * 0x25;
  pPVar5 = prim + lVar59 + 6;
  fVar148 = *(float *)(pPVar5 + 0xc);
  fVar149 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar5) * fVar148;
  fVar158 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar148;
  fVar159 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar148;
  fVar135 = fVar148 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar147 = fVar148 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar148 = fVar148 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar15 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar105 = (undefined1)((uint)uVar15 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar15 >> 0x10);
  uVar150 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar15));
  uVar105 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar150 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar15,(char)uVar15);
  uVar55 = CONCAT62(uVar31,sVar68);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar55;
  auVar123._12_2_ = uVar106;
  auVar123._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar150 >> 0x20);
  auVar137._12_4_ = auVar123._12_4_;
  auVar137._8_2_ = 0;
  auVar137._0_8_ = uVar55;
  auVar137._10_2_ = uVar106;
  auVar70._10_6_ = auVar137._10_6_;
  auVar70._8_2_ = uVar106;
  auVar70._0_8_ = uVar55;
  uVar106 = (undefined2)uVar31;
  auVar32._4_8_ = auVar70._8_8_;
  auVar32._2_2_ = uVar106;
  auVar32._0_2_ = uVar106;
  fVar315 = (float)((int)sVar68 >> 8);
  fVar321 = (float)(auVar32._0_4_ >> 0x18);
  fVar323 = (float)(auVar70._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar105 = (undefined1)((uint)uVar15 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar15 >> 0x10);
  uVar150 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar15));
  uVar105 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar150 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar15,(char)uVar15);
  uVar55 = CONCAT62(uVar31,sVar68);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar55;
  auVar112._12_2_ = uVar106;
  auVar112._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar150 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar55;
  auVar111._10_2_ = uVar106;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar106;
  auVar110._0_8_ = uVar55;
  uVar106 = (undefined2)uVar31;
  auVar33._4_8_ = auVar110._8_8_;
  auVar33._2_2_ = uVar106;
  auVar33._0_2_ = uVar106;
  fVar160 = (float)((int)sVar68 >> 8);
  fVar173 = (float)(auVar33._0_4_ >> 0x18);
  fVar176 = (float)(auVar110._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar105 = (undefined1)((uint)uVar15 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar15 >> 0x10);
  uVar150 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar15));
  uVar105 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar150 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar15,(char)uVar15);
  uVar55 = CONCAT62(uVar31,sVar68);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar55;
  auVar115._12_2_ = uVar106;
  auVar115._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar150 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar55;
  auVar114._10_2_ = uVar106;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar106;
  auVar113._0_8_ = uVar55;
  uVar106 = (undefined2)uVar31;
  auVar34._4_8_ = auVar113._8_8_;
  auVar34._2_2_ = uVar106;
  auVar34._0_2_ = uVar106;
  fVar213 = (float)((int)sVar68 >> 8);
  fVar216 = (float)(auVar34._0_4_ >> 0x18);
  fVar217 = (float)(auVar113._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar105 = (undefined1)((uint)uVar15 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar15 >> 0x10);
  uVar150 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar15));
  uVar105 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar150 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar15,(char)uVar15);
  uVar55 = CONCAT62(uVar31,sVar68);
  auVar118._8_4_ = 0;
  auVar118._0_8_ = uVar55;
  auVar118._12_2_ = uVar106;
  auVar118._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar150 >> 0x20);
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._8_2_ = 0;
  auVar117._0_8_ = uVar55;
  auVar117._10_2_ = uVar106;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._8_2_ = uVar106;
  auVar116._0_8_ = uVar55;
  uVar106 = (undefined2)uVar31;
  auVar35._4_8_ = auVar116._8_8_;
  auVar35._2_2_ = uVar106;
  auVar35._0_2_ = uVar106;
  fVar69 = (float)((int)sVar68 >> 8);
  fVar107 = (float)(auVar35._0_4_ >> 0x18);
  fVar108 = (float)(auVar116._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  uVar105 = (undefined1)((uint)uVar15 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar15 >> 0x10);
  uVar150 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar15));
  uVar105 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar150 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar15,(char)uVar15);
  uVar55 = CONCAT62(uVar31,sVar68);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar55;
  auVar185._12_2_ = uVar106;
  auVar185._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar150 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar55;
  auVar184._10_2_ = uVar106;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar106;
  auVar183._0_8_ = uVar55;
  uVar106 = (undefined2)uVar31;
  auVar36._4_8_ = auVar183._8_8_;
  auVar36._2_2_ = uVar106;
  auVar36._0_2_ = uVar106;
  fVar218 = (float)((int)sVar68 >> 8);
  fVar232 = (float)(auVar36._0_4_ >> 0x18);
  fVar234 = (float)(auVar183._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar54 + 6);
  uVar105 = (undefined1)((uint)uVar15 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar15 >> 0x10);
  uVar150 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar15));
  uVar105 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar150 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar15,(char)uVar15);
  uVar55 = CONCAT62(uVar31,sVar68);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar55;
  auVar188._12_2_ = uVar106;
  auVar188._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar150 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar55;
  auVar187._10_2_ = uVar106;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar106;
  auVar186._0_8_ = uVar55;
  uVar106 = (undefined2)uVar31;
  auVar37._4_8_ = auVar186._8_8_;
  auVar37._2_2_ = uVar106;
  auVar37._0_2_ = uVar106;
  fVar248 = (float)((int)sVar68 >> 8);
  fVar261 = (float)(auVar37._0_4_ >> 0x18);
  fVar263 = (float)(auVar186._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar105 = (undefined1)((uint)uVar15 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar15 >> 0x10);
  uVar150 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar15));
  uVar105 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar150 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar15,(char)uVar15);
  uVar55 = CONCAT62(uVar31,sVar68);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar55;
  auVar191._12_2_ = uVar106;
  auVar191._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar150 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar55;
  auVar190._10_2_ = uVar106;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar106;
  auVar189._0_8_ = uVar55;
  uVar106 = (undefined2)uVar31;
  auVar38._4_8_ = auVar189._8_8_;
  auVar38._2_2_ = uVar106;
  auVar38._0_2_ = uVar106;
  fVar237 = (float)((int)sVar68 >> 8);
  fVar246 = (float)(auVar38._0_4_ >> 0x18);
  fVar247 = (float)(auVar189._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar105 = (undefined1)((uint)uVar15 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar15 >> 0x10);
  uVar150 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar15));
  uVar105 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar150 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar15,(char)uVar15);
  uVar55 = CONCAT62(uVar31,sVar68);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar55;
  auVar194._12_2_ = uVar106;
  auVar194._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar150 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar55;
  auVar193._10_2_ = uVar106;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar106;
  auVar192._0_8_ = uVar55;
  uVar106 = (undefined2)uVar31;
  auVar39._4_8_ = auVar192._8_8_;
  auVar39._2_2_ = uVar106;
  auVar39._0_2_ = uVar106;
  fVar266 = (float)((int)sVar68 >> 8);
  fVar278 = (float)(auVar39._0_4_ >> 0x18);
  fVar281 = (float)(auVar192._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar105 = (undefined1)((uint)uVar15 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar15 >> 0x10);
  uVar150 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar15));
  uVar105 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar150 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar15,(char)uVar15);
  uVar55 = CONCAT62(uVar31,sVar68);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar55;
  auVar197._12_2_ = uVar106;
  auVar197._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar150 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar55;
  auVar196._10_2_ = uVar106;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar106;
  auVar195._0_8_ = uVar55;
  uVar106 = (undefined2)uVar31;
  auVar40._4_8_ = auVar195._8_8_;
  auVar40._2_2_ = uVar106;
  auVar40._0_2_ = uVar106;
  fVar109 = (float)((int)sVar68 >> 8);
  fVar133 = (float)(auVar40._0_4_ >> 0x18);
  fVar134 = (float)(auVar195._8_4_ >> 0x18);
  fVar303 = fVar135 * fVar315 + fVar147 * fVar160 + fVar148 * fVar213;
  fVar312 = fVar135 * fVar321 + fVar147 * fVar173 + fVar148 * fVar216;
  fVar313 = fVar135 * fVar323 + fVar147 * fVar176 + fVar148 * fVar217;
  fVar314 = fVar135 * (float)(auVar137._12_4_ >> 0x18) +
            fVar147 * (float)(auVar111._12_4_ >> 0x18) + fVar148 * (float)(auVar114._12_4_ >> 0x18);
  fVar286 = fVar135 * fVar69 + fVar147 * fVar218 + fVar148 * fVar248;
  fVar297 = fVar135 * fVar107 + fVar147 * fVar232 + fVar148 * fVar261;
  fVar299 = fVar135 * fVar108 + fVar147 * fVar234 + fVar148 * fVar263;
  fVar301 = fVar135 * (float)(auVar117._12_4_ >> 0x18) +
            fVar147 * (float)(auVar184._12_4_ >> 0x18) + fVar148 * (float)(auVar187._12_4_ >> 0x18);
  fVar181 = fVar135 * fVar237 + fVar147 * fVar266 + fVar148 * fVar109;
  fVar208 = fVar135 * fVar246 + fVar147 * fVar278 + fVar148 * fVar133;
  fVar210 = fVar135 * fVar247 + fVar147 * fVar281 + fVar148 * fVar134;
  fVar135 = fVar135 * (float)(auVar190._12_4_ >> 0x18) +
            fVar147 * (float)(auVar193._12_4_ >> 0x18) + fVar148 * (float)(auVar196._12_4_ >> 0x18);
  fVar316 = fVar315 * fVar149 + fVar160 * fVar158 + fVar213 * fVar159;
  fVar321 = fVar321 * fVar149 + fVar173 * fVar158 + fVar216 * fVar159;
  fVar323 = fVar323 * fVar149 + fVar176 * fVar158 + fVar217 * fVar159;
  fVar325 = (float)(auVar137._12_4_ >> 0x18) * fVar149 +
            (float)(auVar111._12_4_ >> 0x18) * fVar158 + (float)(auVar114._12_4_ >> 0x18) * fVar159;
  fVar248 = fVar69 * fVar149 + fVar218 * fVar158 + fVar248 * fVar159;
  fVar261 = fVar107 * fVar149 + fVar232 * fVar158 + fVar261 * fVar159;
  fVar263 = fVar108 * fVar149 + fVar234 * fVar158 + fVar263 * fVar159;
  fVar315 = (float)(auVar117._12_4_ >> 0x18) * fVar149 +
            (float)(auVar184._12_4_ >> 0x18) * fVar158 + (float)(auVar187._12_4_ >> 0x18) * fVar159;
  fVar237 = fVar149 * fVar237 + fVar158 * fVar266 + fVar159 * fVar109;
  fVar246 = fVar149 * fVar246 + fVar158 * fVar278 + fVar159 * fVar133;
  fVar247 = fVar149 * fVar247 + fVar158 * fVar281 + fVar159 * fVar134;
  fVar266 = fVar149 * (float)(auVar190._12_4_ >> 0x18) +
            fVar158 * (float)(auVar193._12_4_ >> 0x18) + fVar159 * (float)(auVar196._12_4_ >> 0x18);
  fVar148 = (float)DAT_01f80d30;
  fVar69 = DAT_01f80d30._4_4_;
  fVar107 = DAT_01f80d30._8_4_;
  fVar108 = DAT_01f80d30._12_4_;
  uVar62 = -(uint)(fVar148 <= ABS(fVar303));
  uVar64 = -(uint)(fVar69 <= ABS(fVar312));
  uVar66 = -(uint)(fVar107 <= ABS(fVar313));
  uVar67 = -(uint)(fVar108 <= ABS(fVar314));
  auVar304._0_4_ = (uint)fVar303 & uVar62;
  auVar304._4_4_ = (uint)fVar312 & uVar64;
  auVar304._8_4_ = (uint)fVar313 & uVar66;
  auVar304._12_4_ = (uint)fVar314 & uVar67;
  auVar151._0_4_ = ~uVar62 & (uint)fVar148;
  auVar151._4_4_ = ~uVar64 & (uint)fVar69;
  auVar151._8_4_ = ~uVar66 & (uint)fVar107;
  auVar151._12_4_ = ~uVar67 & (uint)fVar108;
  auVar151 = auVar151 | auVar304;
  uVar62 = -(uint)(fVar148 <= ABS(fVar286));
  uVar64 = -(uint)(fVar69 <= ABS(fVar297));
  uVar66 = -(uint)(fVar107 <= ABS(fVar299));
  uVar67 = -(uint)(fVar108 <= ABS(fVar301));
  auVar288._0_4_ = (uint)fVar286 & uVar62;
  auVar288._4_4_ = (uint)fVar297 & uVar64;
  auVar288._8_4_ = (uint)fVar299 & uVar66;
  auVar288._12_4_ = (uint)fVar301 & uVar67;
  auVar214._0_4_ = ~uVar62 & (uint)fVar148;
  auVar214._4_4_ = ~uVar64 & (uint)fVar69;
  auVar214._8_4_ = ~uVar66 & (uint)fVar107;
  auVar214._12_4_ = ~uVar67 & (uint)fVar108;
  auVar214 = auVar214 | auVar288;
  uVar62 = -(uint)(fVar148 <= ABS(fVar181));
  uVar64 = -(uint)(fVar69 <= ABS(fVar208));
  uVar66 = -(uint)(fVar107 <= ABS(fVar210));
  uVar67 = -(uint)(fVar108 <= ABS(fVar135));
  auVar198._0_4_ = (uint)fVar181 & uVar62;
  auVar198._4_4_ = (uint)fVar208 & uVar64;
  auVar198._8_4_ = (uint)fVar210 & uVar66;
  auVar198._12_4_ = (uint)fVar135 & uVar67;
  auVar220._0_4_ = ~uVar62 & (uint)fVar148;
  auVar220._4_4_ = ~uVar64 & (uint)fVar69;
  auVar220._8_4_ = ~uVar66 & (uint)fVar107;
  auVar220._12_4_ = ~uVar67 & (uint)fVar108;
  auVar220 = auVar220 | auVar198;
  auVar70 = rcpps(_DAT_01f80d30,auVar151);
  fVar148 = auVar70._0_4_;
  fVar108 = auVar70._4_4_;
  fVar160 = auVar70._8_4_;
  fVar218 = auVar70._12_4_;
  fVar148 = (1.0 - auVar151._0_4_ * fVar148) * fVar148 + fVar148;
  fVar108 = (1.0 - auVar151._4_4_ * fVar108) * fVar108 + fVar108;
  fVar160 = (1.0 - auVar151._8_4_ * fVar160) * fVar160 + fVar160;
  fVar218 = (1.0 - auVar151._12_4_ * fVar218) * fVar218 + fVar218;
  auVar70 = rcpps(auVar70,auVar214);
  fVar69 = auVar70._0_4_;
  fVar109 = auVar70._4_4_;
  fVar173 = auVar70._8_4_;
  fVar232 = auVar70._12_4_;
  fVar69 = (1.0 - auVar214._0_4_ * fVar69) * fVar69 + fVar69;
  fVar109 = (1.0 - auVar214._4_4_ * fVar109) * fVar109 + fVar109;
  fVar173 = (1.0 - auVar214._8_4_ * fVar173) * fVar173 + fVar173;
  fVar232 = (1.0 - auVar214._12_4_ * fVar232) * fVar232 + fVar232;
  auVar70 = rcpps(auVar70,auVar220);
  fVar107 = auVar70._0_4_;
  fVar133 = auVar70._4_4_;
  fVar176 = auVar70._8_4_;
  fVar234 = auVar70._12_4_;
  fVar107 = (1.0 - auVar220._0_4_ * fVar107) * fVar107 + fVar107;
  fVar133 = (1.0 - auVar220._4_4_ * fVar133) * fVar133 + fVar133;
  fVar176 = (1.0 - auVar220._8_4_ * fVar176) * fVar176 + fVar176;
  fVar234 = (1.0 - auVar220._12_4_ * fVar234) * fVar234 + fVar234;
  fVar278 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar59 + 0x16)) *
            *(float *)(prim + lVar59 + 0x1a);
  uVar55 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar106 = (undefined2)(uVar55 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar55;
  auVar71._12_2_ = uVar106;
  auVar71._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar55 >> 0x20);
  auVar255._12_4_ = auVar71._12_4_;
  auVar255._8_2_ = 0;
  auVar255._0_8_ = uVar55;
  auVar255._10_2_ = uVar106;
  auVar139._10_6_ = auVar255._10_6_;
  auVar139._8_2_ = uVar106;
  auVar139._0_8_ = uVar55;
  uVar106 = (undefined2)(uVar55 >> 0x10);
  auVar41._4_8_ = auVar139._8_8_;
  auVar41._2_2_ = uVar106;
  auVar41._0_2_ = uVar106;
  fVar134 = (float)(auVar41._0_4_ >> 0x10);
  fVar181 = (float)(auVar139._8_4_ >> 0x10);
  uVar60 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar106 = (undefined2)(uVar60 >> 0x30);
  auVar154._8_4_ = 0;
  auVar154._0_8_ = uVar60;
  auVar154._12_2_ = uVar106;
  auVar154._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar60 >> 0x20);
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._8_2_ = 0;
  auVar153._0_8_ = uVar60;
  auVar153._10_2_ = uVar106;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._8_2_ = uVar106;
  auVar152._0_8_ = uVar60;
  uVar106 = (undefined2)(uVar60 >> 0x10);
  auVar42._4_8_ = auVar152._8_8_;
  auVar42._2_2_ = uVar106;
  auVar42._0_2_ = uVar106;
  uVar6 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar106 = (undefined2)(uVar6 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar6;
  auVar74._12_2_ = uVar106;
  auVar74._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar6 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar6;
  auVar73._10_2_ = uVar106;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar106;
  auVar72._0_8_ = uVar6;
  uVar106 = (undefined2)(uVar6 >> 0x10);
  auVar43._4_8_ = auVar72._8_8_;
  auVar43._2_2_ = uVar106;
  auVar43._0_2_ = uVar106;
  fVar135 = (float)(auVar43._0_4_ >> 0x10);
  fVar208 = (float)(auVar72._8_4_ >> 0x10);
  uVar7 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar106 = (undefined2)(uVar7 >> 0x30);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar7;
  auVar223._12_2_ = uVar106;
  auVar223._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar7 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar7;
  auVar222._10_2_ = uVar106;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar106;
  auVar221._0_8_ = uVar7;
  uVar106 = (undefined2)(uVar7 >> 0x10);
  auVar44._4_8_ = auVar221._8_8_;
  auVar44._2_2_ = uVar106;
  auVar44._0_2_ = uVar106;
  uVar8 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar106 = (undefined2)(uVar8 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar8;
  auVar77._12_2_ = uVar106;
  auVar77._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar8 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar8;
  auVar76._10_2_ = uVar106;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar106;
  auVar75._0_8_ = uVar8;
  uVar106 = (undefined2)(uVar8 >> 0x10);
  auVar45._4_8_ = auVar75._8_8_;
  auVar45._2_2_ = uVar106;
  auVar45._0_2_ = uVar106;
  fVar147 = (float)(auVar45._0_4_ >> 0x10);
  fVar210 = (float)(auVar75._8_4_ >> 0x10);
  uVar58 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar9 = *(ulong *)(prim + uVar54 * 2 + uVar58 + 6);
  uVar106 = (undefined2)(uVar9 >> 0x30);
  auVar252._8_4_ = 0;
  auVar252._0_8_ = uVar9;
  auVar252._12_2_ = uVar106;
  auVar252._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar9 >> 0x20);
  auVar251._12_4_ = auVar252._12_4_;
  auVar251._8_2_ = 0;
  auVar251._0_8_ = uVar9;
  auVar251._10_2_ = uVar106;
  auVar250._10_6_ = auVar251._10_6_;
  auVar250._8_2_ = uVar106;
  auVar250._0_8_ = uVar9;
  uVar106 = (undefined2)(uVar9 >> 0x10);
  auVar46._4_8_ = auVar250._8_8_;
  auVar46._2_2_ = uVar106;
  auVar46._0_2_ = uVar106;
  uVar58 = *(ulong *)(prim + uVar58 + 6);
  uVar106 = (undefined2)(uVar58 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar58;
  auVar80._12_2_ = uVar106;
  auVar80._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar58 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar58;
  auVar79._10_2_ = uVar106;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar106;
  auVar78._0_8_ = uVar58;
  uVar106 = (undefined2)(uVar58 >> 0x10);
  auVar47._4_8_ = auVar78._8_8_;
  auVar47._2_2_ = uVar106;
  auVar47._0_2_ = uVar106;
  fVar149 = (float)(auVar47._0_4_ >> 0x10);
  fVar213 = (float)(auVar78._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar106 = (undefined2)(uVar10 >> 0x30);
  auVar271._8_4_ = 0;
  auVar271._0_8_ = uVar10;
  auVar271._12_2_ = uVar106;
  auVar271._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar10 >> 0x20);
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._8_2_ = 0;
  auVar270._0_8_ = uVar10;
  auVar270._10_2_ = uVar106;
  auVar269._10_6_ = auVar270._10_6_;
  auVar269._8_2_ = uVar106;
  auVar269._0_8_ = uVar10;
  uVar106 = (undefined2)(uVar10 >> 0x10);
  auVar48._4_8_ = auVar269._8_8_;
  auVar48._2_2_ = uVar106;
  auVar48._0_2_ = uVar106;
  uVar11 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar106 = (undefined2)(uVar11 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar11;
  auVar83._12_2_ = uVar106;
  auVar83._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar11 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar11;
  auVar82._10_2_ = uVar106;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar106;
  auVar81._0_8_ = uVar11;
  uVar106 = (undefined2)(uVar11 >> 0x10);
  auVar49._4_8_ = auVar81._8_8_;
  auVar49._2_2_ = uVar106;
  auVar49._0_2_ = uVar106;
  fVar158 = (float)(auVar49._0_4_ >> 0x10);
  fVar216 = (float)(auVar81._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar14 * 0x20 + 6);
  uVar106 = (undefined2)(uVar12 >> 0x30);
  auVar291._8_4_ = 0;
  auVar291._0_8_ = uVar12;
  auVar291._12_2_ = uVar106;
  auVar291._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar12 >> 0x20);
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._8_2_ = 0;
  auVar290._0_8_ = uVar12;
  auVar290._10_2_ = uVar106;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289._8_2_ = uVar106;
  auVar289._0_8_ = uVar12;
  uVar106 = (undefined2)(uVar12 >> 0x10);
  auVar50._4_8_ = auVar289._8_8_;
  auVar50._2_2_ = uVar106;
  auVar50._0_2_ = uVar106;
  uVar13 = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar54) + 6);
  uVar106 = (undefined2)(uVar13 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar13;
  auVar86._12_2_ = uVar106;
  auVar86._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar13 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar13;
  auVar85._10_2_ = uVar106;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar106;
  auVar84._0_8_ = uVar13;
  uVar106 = (undefined2)(uVar13 >> 0x10);
  auVar51._4_8_ = auVar84._8_8_;
  auVar51._2_2_ = uVar106;
  auVar51._0_2_ = uVar106;
  fVar159 = (float)(auVar51._0_4_ >> 0x10);
  fVar217 = (float)(auVar84._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar106 = (undefined2)(uVar54 >> 0x30);
  auVar307._8_4_ = 0;
  auVar307._0_8_ = uVar54;
  auVar307._12_2_ = uVar106;
  auVar307._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar54 >> 0x20);
  auVar306._12_4_ = auVar307._12_4_;
  auVar306._8_2_ = 0;
  auVar306._0_8_ = uVar54;
  auVar306._10_2_ = uVar106;
  auVar305._10_6_ = auVar306._10_6_;
  auVar305._8_2_ = uVar106;
  auVar305._0_8_ = uVar54;
  uVar106 = (undefined2)(uVar54 >> 0x10);
  auVar52._4_8_ = auVar305._8_8_;
  auVar52._2_2_ = uVar106;
  auVar52._0_2_ = uVar106;
  auVar155._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar134) * fVar278 + fVar134) - fVar321) *
                fVar108,((((float)(int)(short)uVar60 - (float)(int)(short)uVar55) * fVar278 +
                         (float)(int)(short)uVar55) - fVar316) * fVar148);
  auVar155._8_4_ =
       ((((float)(auVar152._8_4_ >> 0x10) - fVar181) * fVar278 + fVar181) - fVar323) * fVar160;
  auVar155._12_4_ =
       ((((float)(auVar153._12_4_ >> 0x10) - (float)(auVar255._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar255._12_4_ >> 0x10)) - fVar325) * fVar218;
  auVar224._0_4_ =
       ((((float)(int)(short)uVar7 - (float)(int)(short)uVar6) * fVar278 + (float)(int)(short)uVar6)
       - fVar316) * fVar148;
  auVar224._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar135) * fVar278 + fVar135) - fVar321) * fVar108;
  auVar224._8_4_ =
       ((((float)(auVar221._8_4_ >> 0x10) - fVar208) * fVar278 + fVar208) - fVar323) * fVar160;
  auVar224._12_4_ =
       ((((float)(auVar222._12_4_ >> 0x10) - (float)(auVar73._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar73._12_4_ >> 0x10)) - fVar325) * fVar218;
  auVar253._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar147) * fVar278 + fVar147) - fVar261) *
                fVar109,((((float)(int)(short)uVar9 - (float)(int)(short)uVar8) * fVar278 +
                         (float)(int)(short)uVar8) - fVar248) * fVar69);
  auVar253._8_4_ =
       ((((float)(auVar250._8_4_ >> 0x10) - fVar210) * fVar278 + fVar210) - fVar263) * fVar173;
  auVar253._12_4_ =
       ((((float)(auVar251._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar315) * fVar232;
  auVar272._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar58) * fVar278 +
        (float)(int)(short)uVar58) - fVar248) * fVar69;
  auVar272._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar149) * fVar278 + fVar149) - fVar261) * fVar109;
  auVar272._8_4_ =
       ((((float)(auVar269._8_4_ >> 0x10) - fVar213) * fVar278 + fVar213) - fVar263) * fVar173;
  auVar272._12_4_ =
       ((((float)(auVar270._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar315) * fVar232;
  auVar292._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar158) * fVar278 + fVar158) - fVar246) *
                fVar133,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar278 +
                         (float)(int)(short)uVar11) - fVar237) * fVar107);
  auVar292._8_4_ =
       ((((float)(auVar289._8_4_ >> 0x10) - fVar216) * fVar278 + fVar216) - fVar247) * fVar176;
  auVar292._12_4_ =
       ((((float)(auVar290._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar266) * fVar234;
  auVar308._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar13) * fVar278 +
        (float)(int)(short)uVar13) - fVar237) * fVar107;
  auVar308._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar159) * fVar278 + fVar159) - fVar246) * fVar133;
  auVar308._8_4_ =
       ((((float)(auVar305._8_4_ >> 0x10) - fVar217) * fVar278 + fVar217) - fVar247) * fVar176;
  auVar308._12_4_ =
       ((((float)(auVar306._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar266) * fVar234;
  auVar136._8_4_ = auVar155._8_4_;
  auVar136._0_8_ = auVar155._0_8_;
  auVar136._12_4_ = auVar155._12_4_;
  auVar137 = minps(auVar136,auVar224);
  auVar87._8_4_ = auVar253._8_4_;
  auVar87._0_8_ = auVar253._0_8_;
  auVar87._12_4_ = auVar253._12_4_;
  auVar70 = minps(auVar87,auVar272);
  auVar137 = maxps(auVar137,auVar70);
  auVar88._8_4_ = auVar292._8_4_;
  auVar88._0_8_ = auVar292._0_8_;
  auVar88._12_4_ = auVar292._12_4_;
  auVar70 = minps(auVar88,auVar308);
  uVar15 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar119._4_4_ = uVar15;
  auVar119._0_4_ = uVar15;
  auVar119._8_4_ = uVar15;
  auVar119._12_4_ = uVar15;
  auVar70 = maxps(auVar70,auVar119);
  auVar70 = maxps(auVar137,auVar70);
  local_1a8 = auVar70._0_4_ * 0.99999964;
  fStack_1a4 = auVar70._4_4_ * 0.99999964;
  fStack_1a0 = auVar70._8_4_ * 0.99999964;
  fStack_19c = auVar70._12_4_ * 0.99999964;
  auVar70 = maxps(auVar155,auVar224);
  auVar137 = maxps(auVar253,auVar272);
  auVar70 = minps(auVar70,auVar137);
  auVar137 = maxps(auVar292,auVar308);
  fVar148 = (ray->super_RayK<1>).tfar;
  auVar89._4_4_ = fVar148;
  auVar89._0_4_ = fVar148;
  auVar89._8_4_ = fVar148;
  auVar89._12_4_ = fVar148;
  auVar137 = minps(auVar137,auVar89);
  auVar70 = minps(auVar70,auVar137);
  uVar62 = (uint)(byte)PVar14;
  auVar120._0_4_ = -(uint)(uVar62 != 0 && local_1a8 <= auVar70._0_4_ * 1.0000004);
  auVar120._4_4_ = -(uint)(1 < uVar62 && fStack_1a4 <= auVar70._4_4_ * 1.0000004);
  auVar120._8_4_ = -(uint)(2 < uVar62 && fStack_1a0 <= auVar70._8_4_ * 1.0000004);
  auVar120._12_4_ = -(uint)(3 < uVar62 && fStack_19c <= auVar70._12_4_ * 1.0000004);
  uVar62 = movmskps(uVar62,auVar120);
  if (uVar62 == 0) {
    return;
  }
  uVar62 = uVar62 & 0xff;
  local_158._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_158._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_158._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_158._12_4_ = 0;
  local_280 = prim;
LAB_00b4e756:
  lVar59 = 0;
  if ((ulong)uVar62 != 0) {
    for (; (uVar62 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
    }
  }
  uVar64 = *(uint *)(local_280 + 2);
  uVar66 = *(uint *)(local_280 + lVar59 * 4 + 6);
  pGVar16 = (context->scene->geometries).items[uVar64].ptr;
  fVar148 = pGVar16->fnumTimeSegments;
  fVar69 = (pGVar16->time_range).lower;
  fVar107 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar69) /
            ((pGVar16->time_range).upper - fVar69)) * fVar148;
  fVar69 = floorf(fVar107);
  fVar148 = fVar148 + -1.0;
  if (fVar148 <= fVar69) {
    fVar69 = fVar148;
  }
  fVar148 = 0.0;
  if (0.0 <= fVar69) {
    fVar148 = fVar69;
  }
  fVar107 = fVar107 - fVar148;
  local_310 = (ulong)uVar66;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                           (ulong)uVar66 *
                           pGVar16[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar57 = (long)(int)fVar148 * 0x38;
  lVar18 = *(long *)(_Var17 + lVar57);
  lVar19 = *(long *)(_Var17 + 0x10 + lVar57);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar55);
  fVar148 = *pfVar3;
  fVar69 = pfVar3[1];
  fVar108 = pfVar3[2];
  fVar109 = pfVar3[3];
  lVar59 = uVar55 + 1;
  pauVar4 = (undefined1 (*) [12])(lVar18 + lVar19 * lVar59);
  auVar32 = *pauVar4;
  fVar133 = *(float *)pauVar4[1];
  lVar1 = uVar55 + 2;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar134 = *pfVar3;
  fVar135 = pfVar3[1];
  fVar147 = pfVar3[2];
  fVar149 = pfVar3[3];
  lVar2 = uVar55 + 3;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar158 = *pfVar3;
  fVar159 = pfVar3[1];
  fVar160 = pfVar3[2];
  fVar173 = pfVar3[3];
  lVar18 = *(long *)&pGVar16[4].fnumTimeSegments;
  lVar19 = *(long *)(lVar18 + lVar57);
  lVar20 = *(long *)(lVar18 + 0x10 + lVar57);
  pfVar3 = (float *)(lVar19 + lVar20 * uVar55);
  fVar176 = *pfVar3;
  fVar181 = pfVar3[1];
  fVar208 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar59);
  fVar213 = *pfVar3;
  fVar216 = pfVar3[1];
  fVar217 = pfVar3[2];
  fVar218 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar1);
  fVar232 = *pfVar3;
  fVar234 = pfVar3[1];
  fVar248 = pfVar3[2];
  fVar261 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar2);
  fVar263 = *pfVar3;
  fVar315 = pfVar3[1];
  fVar237 = pfVar3[2];
  fVar246 = pfVar3[3];
  fVar247 = *(float *)*pauVar4 * 0.0;
  fVar266 = *(float *)(*pauVar4 + 4) * 0.0;
  fVar278 = *(float *)(*pauVar4 + 8) * 0.0;
  fVar316 = (fVar134 * 0.5 + fVar158 * 0.0 + fVar247) - fVar148 * 0.5;
  fVar321 = (fVar135 * 0.5 + fVar159 * 0.0 + fVar266) - fVar69 * 0.5;
  fVar323 = (fVar147 * 0.5 + fVar160 * 0.0 + fVar278) - fVar108 * 0.5;
  fVar325 = (fVar149 * 0.5 + fVar173 * 0.0 + fVar133 * 0.0) - fVar109 * 0.5;
  fVar287 = (fVar232 * 0.5 + fVar263 * 0.0 + fVar213 * 0.0) - fVar176 * 0.5;
  fVar298 = (fVar234 * 0.5 + fVar315 * 0.0 + fVar216 * 0.0) - fVar181 * 0.5;
  fVar300 = (fVar248 * 0.5 + fVar237 * 0.0 + fVar217 * 0.0) - fVar208 * 0.5;
  fVar302 = (fVar261 * 0.5 + fVar246 * 0.0 + fVar218 * 0.0) - fVar210 * 0.5;
  fVar281 = fVar134 * 0.0 + fVar158 * -0.0 + *(float *)*pauVar4 + fVar148 * -0.0;
  fVar286 = fVar135 * 0.0 + fVar159 * -0.0 + *(float *)(*pauVar4 + 4) + fVar69 * -0.0;
  fVar297 = fVar147 * 0.0 + fVar160 * -0.0 + *(float *)(*pauVar4 + 8) + fVar108 * -0.0;
  fVar301 = fVar149 * 0.0 + fVar173 * -0.0 + fVar133 + fVar109 * -0.0;
  fVar317 = fVar232 * 0.0 + fVar263 * -0.0 + fVar213 + fVar176 * -0.0;
  fVar322 = fVar234 * 0.0 + fVar315 * -0.0 + fVar216 + fVar181 * -0.0;
  fVar324 = fVar248 * 0.0 + fVar237 * -0.0 + fVar217 + fVar208 * -0.0;
  fVar326 = fVar261 * 0.0 + fVar246 * -0.0 + fVar218 + fVar210 * -0.0;
  fVar247 = fVar158 * -0.0 + fVar134 + fVar247 + fVar148 * -0.0;
  fVar266 = fVar159 * -0.0 + fVar135 + fVar266 + fVar69 * -0.0;
  fVar278 = fVar160 * -0.0 + fVar147 + fVar278 + fVar108 * -0.0;
  fVar299 = fVar173 * -0.0 + fVar149 + fVar133 * 0.0 + fVar109 * -0.0;
  local_328._0_4_ = auVar32._0_4_;
  local_328._4_4_ = auVar32._4_4_;
  fStack_320 = auVar32._8_4_;
  fVar303 = fVar148 * 0.0 + ((fVar158 * 0.5 + fVar134 * 0.0) - (float)local_328._0_4_ * 0.5);
  fVar312 = fVar69 * 0.0 + ((fVar159 * 0.5 + fVar135 * 0.0) - (float)local_328._4_4_ * 0.5);
  fVar313 = fVar108 * 0.0 + ((fVar160 * 0.5 + fVar147 * 0.0) - fStack_320 * 0.5);
  fVar314 = fVar109 * 0.0 + ((fVar173 * 0.5 + fVar149 * 0.0) - fVar133 * 0.5);
  fVar133 = fVar263 * -0.0 + fVar232 + fVar213 * 0.0 + fVar176 * -0.0;
  fVar134 = fVar315 * -0.0 + fVar234 + fVar216 * 0.0 + fVar181 * -0.0;
  fVar135 = fVar237 * -0.0 + fVar248 + fVar217 * 0.0 + fVar208 * -0.0;
  fVar149 = fVar246 * -0.0 + fVar261 + fVar218 * 0.0 + fVar210 * -0.0;
  fVar148 = fVar176 * 0.0 + ((fVar263 * 0.5 + fVar232 * 0.0) - fVar213 * 0.5);
  fVar69 = fVar181 * 0.0 + ((fVar315 * 0.5 + fVar234 * 0.0) - fVar216 * 0.5);
  fVar108 = fVar208 * 0.0 + ((fVar237 * 0.5 + fVar248 * 0.0) - fVar217 * 0.5);
  fVar109 = fVar210 * 0.0 + ((fVar246 * 0.5 + fVar261 * 0.0) - fVar218 * 0.5);
  fVar218 = fVar321 * fVar317 - fVar322 * fVar316;
  fVar232 = fVar323 * fVar322 - fVar324 * fVar321;
  fVar234 = fVar316 * fVar324 - fVar317 * fVar323;
  fVar248 = fVar325 * fVar326 - fVar326 * fVar325;
  fVar173 = fVar321 * fVar287 - fVar298 * fVar316;
  fVar181 = fVar323 * fVar298 - fVar300 * fVar321;
  fVar208 = fVar316 * fVar300 - fVar287 * fVar323;
  fVar147 = fVar312 * fVar133 - fVar134 * fVar303;
  fVar158 = fVar313 * fVar134 - fVar135 * fVar312;
  fVar159 = fVar303 * fVar135 - fVar133 * fVar313;
  fVar160 = fVar314 * fVar149 - fVar149 * fVar314;
  fVar133 = fVar312 * fVar148 - fVar69 * fVar303;
  fVar134 = fVar313 * fVar69 - fVar108 * fVar312;
  fVar108 = fVar303 * fVar108 - fVar148 * fVar313;
  fVar213 = fVar234 * fVar234 + fVar232 * fVar232 + fVar218 * fVar218;
  auVar137 = ZEXT416((uint)fVar213);
  auVar70 = rsqrtss(ZEXT416((uint)fVar213),auVar137);
  fVar148 = auVar70._0_4_;
  fVar216 = fVar148 * 1.5 - fVar148 * fVar148 * fVar213 * 0.5 * fVar148;
  fVar261 = fVar218 * fVar173 + fVar234 * fVar208 + fVar232 * fVar181;
  fVar148 = fVar248 * fVar216;
  auVar70 = rcpss(auVar137,auVar137);
  fVar176 = (2.0 - fVar213 * auVar70._0_4_) * auVar70._0_4_;
  fVar210 = fVar159 * fVar159 + fVar158 * fVar158 + fVar147 * fVar147;
  auVar70 = ZEXT416((uint)fVar210);
  auVar137 = rsqrtss(ZEXT416((uint)fVar210),auVar70);
  fVar69 = auVar137._0_4_;
  fVar149 = fVar69 * 1.5 - fVar69 * fVar69 * fVar210 * 0.5 * fVar69;
  fVar217 = fVar147 * fVar133 + fVar159 * fVar108 + fVar158 * fVar134;
  fVar135 = fVar160 * fVar149;
  auVar70 = rcpss(auVar70,auVar70);
  fVar69 = (2.0 - fVar210 * auVar70._0_4_) * auVar70._0_4_;
  fVar219 = fVar301 * fVar232 * fVar216;
  fVar233 = fVar301 * fVar234 * fVar216;
  fVar235 = fVar301 * fVar218 * fVar216;
  fVar236 = fVar301 * fVar148;
  fVar267 = fVar281 - fVar219;
  fVar279 = fVar286 - fVar233;
  fVar282 = fVar297 - fVar235;
  fVar284 = fVar301 - fVar236;
  fVar249 = fVar301 * fVar176 * (fVar213 * fVar181 - fVar261 * fVar232) * fVar216 +
            fVar325 * fVar232 * fVar216;
  fVar262 = fVar301 * fVar176 * (fVar213 * fVar208 - fVar261 * fVar234) * fVar216 +
            fVar325 * fVar234 * fVar216;
  fVar264 = fVar301 * fVar176 * (fVar213 * fVar173 - fVar261 * fVar218) * fVar216 +
            fVar325 * fVar218 * fVar216;
  fVar265 = fVar301 * fVar176 * (fVar213 * (fVar325 * fVar302 - fVar302 * fVar325) -
                                fVar261 * fVar248) * fVar216 + fVar325 * fVar148;
  fVar219 = fVar219 + fVar281;
  fVar233 = fVar233 + fVar286;
  fVar235 = fVar235 + fVar297;
  fVar236 = fVar236 + fVar301;
  fVar281 = fVar299 * fVar158 * fVar149;
  fVar286 = fVar299 * fVar159 * fVar149;
  fVar297 = fVar299 * fVar147 * fVar149;
  fVar301 = fVar299 * fVar135;
  fVar326 = fVar247 - fVar281;
  fVar174 = fVar266 - fVar286;
  fVar177 = fVar278 - fVar297;
  fVar179 = fVar299 - fVar301;
  fVar287 = fVar299 * fVar69 * (fVar210 * fVar134 - fVar217 * fVar158) * fVar149 +
            fVar314 * fVar158 * fVar149;
  fVar298 = fVar299 * fVar69 * (fVar210 * fVar108 - fVar217 * fVar159) * fVar149 +
            fVar314 * fVar159 * fVar149;
  fVar302 = fVar299 * fVar69 * (fVar210 * fVar133 - fVar217 * fVar147) * fVar149 +
            fVar314 * fVar147 * fVar149;
  fVar322 = fVar299 * fVar69 * (fVar210 * (fVar314 * fVar109 - fVar109 * fVar314) -
                               fVar217 * fVar160) * fVar149 + fVar314 * fVar135;
  fVar281 = fVar281 + fVar247;
  fVar286 = fVar286 + fVar266;
  fVar297 = fVar297 + fVar278;
  fVar301 = fVar301 + fVar299;
  lVar19 = *(long *)(_Var17 + 0x38 + lVar57);
  lVar20 = *(long *)(_Var17 + 0x48 + lVar57);
  pfVar3 = (float *)(lVar19 + lVar20 * uVar55);
  fVar148 = *pfVar3;
  fVar69 = pfVar3[1];
  fVar108 = pfVar3[2];
  fVar109 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar59);
  fVar133 = *pfVar3;
  fVar134 = pfVar3[1];
  fVar135 = pfVar3[2];
  fVar147 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar1);
  fVar149 = *pfVar3;
  fVar158 = pfVar3[1];
  fVar159 = pfVar3[2];
  fVar160 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar2);
  fVar173 = *pfVar3;
  fVar176 = pfVar3[1];
  fVar181 = pfVar3[2];
  fVar208 = pfVar3[3];
  fVar161 = (fVar149 * 0.5 + fVar173 * 0.0 + fVar133 * 0.0) - fVar148 * 0.5;
  fVar175 = (fVar158 * 0.5 + fVar176 * 0.0 + fVar134 * 0.0) - fVar69 * 0.5;
  fVar178 = (fVar159 * 0.5 + fVar181 * 0.0 + fVar135 * 0.0) - fVar108 * 0.5;
  fVar180 = (fVar160 * 0.5 + fVar208 * 0.0 + fVar147 * 0.0) - fVar109 * 0.5;
  lVar19 = *(long *)(lVar18 + 0x38 + lVar57);
  lVar18 = *(long *)(lVar18 + 0x48 + lVar57);
  uVar55 = uVar55 * lVar18;
  pfVar3 = (float *)(lVar19 + lVar18 * lVar2);
  fVar210 = *pfVar3;
  fVar213 = pfVar3[1];
  fVar216 = pfVar3[2];
  fVar217 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar1 * lVar18);
  fVar218 = *pfVar3;
  fVar232 = pfVar3[1];
  fVar234 = pfVar3[2];
  fVar248 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar59 * lVar18);
  fVar261 = *pfVar3;
  fVar263 = pfVar3[1];
  fVar315 = pfVar3[2];
  fVar237 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + uVar55);
  fVar246 = *pfVar3;
  fVar247 = pfVar3[1];
  fVar266 = pfVar3[2];
  fVar278 = pfVar3[3];
  fVar268 = (fVar218 * 0.5 + fVar210 * 0.0 + fVar261 * 0.0) - fVar246 * 0.5;
  fVar280 = (fVar232 * 0.5 + fVar213 * 0.0 + fVar263 * 0.0) - fVar247 * 0.5;
  fVar283 = (fVar234 * 0.5 + fVar216 * 0.0 + fVar315 * 0.0) - fVar266 * 0.5;
  fVar285 = (fVar248 * 0.5 + fVar217 * 0.0 + fVar237 * 0.0) - fVar278 * 0.5;
  fVar299 = fVar149 * 0.0 + fVar173 * -0.0 + fVar133 + fVar148 * -0.0;
  fVar300 = fVar158 * 0.0 + fVar176 * -0.0 + fVar134 + fVar69 * -0.0;
  fVar317 = fVar159 * 0.0 + fVar181 * -0.0 + fVar135 + fVar108 * -0.0;
  fVar324 = fVar160 * 0.0 + fVar208 * -0.0 + fVar147 + fVar109 * -0.0;
  fVar182 = fVar173 * -0.0 + fVar149 + fVar133 * 0.0 + fVar148 * -0.0;
  fVar209 = fVar176 * -0.0 + fVar158 + fVar134 * 0.0 + fVar69 * -0.0;
  fVar211 = fVar181 * -0.0 + fVar159 + fVar135 * 0.0 + fVar108 * -0.0;
  fVar212 = fVar208 * -0.0 + fVar160 + fVar147 * 0.0 + fVar109 * -0.0;
  fVar149 = fVar148 * 0.0 + ((fVar173 * 0.5 + fVar149 * 0.0) - fVar133 * 0.5);
  fVar173 = fVar69 * 0.0 + ((fVar176 * 0.5 + fVar158 * 0.0) - fVar134 * 0.5);
  fVar176 = fVar108 * 0.0 + ((fVar181 * 0.5 + fVar159 * 0.0) - fVar135 * 0.5);
  fVar181 = fVar109 * 0.0 + ((fVar208 * 0.5 + fVar160 * 0.0) - fVar147 * 0.5);
  fVar133 = fVar218 * 0.0 + fVar210 * -0.0 + fVar261 + fVar246 * -0.0;
  fVar147 = fVar232 * 0.0 + fVar213 * -0.0 + fVar263 + fVar247 * -0.0;
  fVar158 = fVar234 * 0.0 + fVar216 * -0.0 + fVar315 + fVar266 * -0.0;
  fVar159 = fVar248 * 0.0 + fVar217 * -0.0 + fVar237 + fVar278 * -0.0;
  fVar148 = fVar210 * -0.0 + fVar218 + fVar261 * 0.0 + fVar246 * -0.0;
  fVar69 = fVar213 * -0.0 + fVar232 + fVar263 * 0.0 + fVar247 * -0.0;
  fVar108 = fVar216 * -0.0 + fVar234 + fVar315 * 0.0 + fVar266 * -0.0;
  fVar109 = fVar217 * -0.0 + fVar248 + fVar237 * 0.0 + fVar278 * -0.0;
  fVar135 = fVar246 * 0.0 + ((fVar210 * 0.5 + fVar218 * 0.0) - fVar261 * 0.5);
  fVar134 = fVar247 * 0.0 + ((fVar213 * 0.5 + fVar232 * 0.0) - fVar263 * 0.5);
  fVar208 = fVar266 * 0.0 + ((fVar216 * 0.5 + fVar234 * 0.0) - fVar315 * 0.5);
  fVar247 = fVar278 * 0.0 + ((fVar217 * 0.5 + fVar248 * 0.0) - fVar237 * 0.5);
  fVar248 = fVar175 * fVar133 - fVar147 * fVar161;
  fVar261 = fVar178 * fVar147 - fVar158 * fVar175;
  fVar263 = fVar161 * fVar158 - fVar133 * fVar178;
  fVar315 = fVar180 * fVar159 - fVar159 * fVar180;
  fVar160 = fVar175 * fVar268 - fVar280 * fVar161;
  fVar158 = fVar178 * fVar280 - fVar283 * fVar175;
  fVar159 = fVar161 * fVar283 - fVar268 * fVar178;
  fVar147 = fVar173 * fVar148 - fVar69 * fVar149;
  fVar213 = fVar176 * fVar69 - fVar108 * fVar173;
  fVar217 = fVar149 * fVar108 - fVar148 * fVar176;
  fVar232 = fVar181 * fVar109 - fVar109 * fVar181;
  fVar133 = fVar173 * fVar135 - fVar134 * fVar149;
  fVar134 = fVar176 * fVar134 - fVar208 * fVar173;
  fVar135 = fVar149 * fVar208 - fVar135 * fVar176;
  fVar109 = fVar263 * fVar263 + fVar261 * fVar261 + fVar248 * fVar248;
  auVar137 = ZEXT416((uint)fVar109);
  auVar70 = rsqrtss(ZEXT416((uint)fVar109),auVar137);
  fVar148 = auVar70._0_4_;
  fVar208 = fVar148 * 1.5 - fVar148 * fVar148 * fVar109 * 0.5 * fVar148;
  fVar148 = fVar248 * fVar160 + fVar263 * fVar159 + fVar261 * fVar158;
  auVar70 = rcpss(auVar137,auVar137);
  fVar69 = (2.0 - fVar109 * auVar70._0_4_) * auVar70._0_4_;
  fVar108 = fVar315 * fVar208;
  fVar266 = fVar217 * fVar217 + fVar213 * fVar213 + fVar147 * fVar147;
  auVar70 = ZEXT416((uint)fVar266);
  auVar137 = rsqrtss(ZEXT416((uint)fVar266),auVar70);
  fVar210 = auVar137._0_4_;
  fVar268 = fVar210 * 1.5 - fVar210 * fVar210 * fVar266 * 0.5 * fVar210;
  fVar280 = fVar147 * fVar133 + fVar217 * fVar135 + fVar213 * fVar134;
  auVar70 = rcpss(auVar70,auVar70);
  fVar283 = (2.0 - fVar266 * auVar70._0_4_) * auVar70._0_4_;
  fVar278 = fVar232 * fVar268;
  fVar210 = fVar324 * fVar261 * fVar208;
  fVar216 = fVar324 * fVar263 * fVar208;
  fVar218 = fVar324 * fVar248 * fVar208;
  fVar234 = fVar324 * fVar108;
  fVar158 = fVar324 * fVar69 * (fVar109 * fVar158 - fVar148 * fVar261) * fVar208 +
            fVar180 * fVar261 * fVar208;
  fVar159 = fVar324 * fVar69 * (fVar109 * fVar159 - fVar148 * fVar263) * fVar208 +
            fVar180 * fVar263 * fVar208;
  fVar160 = fVar324 * fVar69 * (fVar109 * fVar160 - fVar148 * fVar248) * fVar208 +
            fVar180 * fVar248 * fVar208;
  fVar208 = fVar324 * fVar69 * (fVar109 * (fVar180 * fVar285 - fVar285 * fVar180) -
                               fVar148 * fVar315) * fVar208 + fVar180 * fVar108;
  fVar248 = fVar299 - fVar210;
  fVar261 = fVar300 - fVar216;
  fVar263 = fVar317 - fVar218;
  fVar315 = fVar324 - fVar234;
  fVar210 = fVar210 + fVar299;
  fVar216 = fVar216 + fVar300;
  fVar218 = fVar218 + fVar317;
  fVar234 = fVar234 + fVar324;
  fVar148 = fVar212 * fVar213 * fVar268;
  fVar69 = fVar212 * fVar217 * fVar268;
  fVar108 = fVar212 * fVar147 * fVar268;
  fVar109 = fVar212 * fVar278;
  fVar213 = fVar212 * fVar283 * (fVar266 * fVar134 - fVar280 * fVar213) * fVar268 +
            fVar181 * fVar213 * fVar268;
  fVar237 = fVar212 * fVar283 * (fVar266 * fVar135 - fVar280 * fVar217) * fVar268 +
            fVar181 * fVar217 * fVar268;
  fVar246 = fVar212 * fVar283 * (fVar266 * fVar133 - fVar280 * fVar147) * fVar268 +
            fVar181 * fVar147 * fVar268;
  fVar232 = fVar212 * fVar283 * (fVar266 * (fVar181 * fVar247 - fVar247 * fVar181) -
                                fVar280 * fVar232) * fVar268 + fVar181 * fVar278;
  fVar133 = fVar182 - fVar148;
  fVar134 = fVar209 - fVar69;
  fVar135 = fVar211 - fVar108;
  fVar147 = fVar212 - fVar109;
  fVar148 = fVar148 + fVar182;
  fVar69 = fVar69 + fVar209;
  fVar108 = fVar108 + fVar211;
  fVar109 = fVar109 + fVar212;
  fVar217 = 1.0 - fVar107;
  local_378 = fVar267 * fVar217 + fVar248 * fVar107;
  fStack_374 = fVar279 * fVar217 + fVar261 * fVar107;
  fStack_370 = fVar282 * fVar217 + fVar263 * fVar107;
  fStack_36c = fVar284 * fVar217 + fVar315 * fVar107;
  local_388 = ((fVar316 - fVar249) * 0.33333334 + fVar267) * fVar217 +
              ((fVar161 - fVar158) * 0.33333334 + fVar248) * fVar107;
  fStack_384 = ((fVar321 - fVar262) * 0.33333334 + fVar279) * fVar217 +
               ((fVar175 - fVar159) * 0.33333334 + fVar261) * fVar107;
  fStack_380 = ((fVar323 - fVar264) * 0.33333334 + fVar282) * fVar217 +
               ((fVar178 - fVar160) * 0.33333334 + fVar263) * fVar107;
  fStack_37c = ((fVar325 - fVar265) * 0.33333334 + fVar284) * fVar217 +
               ((fVar180 - fVar208) * 0.33333334 + fVar315) * fVar107;
  local_3a8 = (fVar326 - (fVar303 - fVar287) * 0.33333334) * fVar217 +
              (fVar133 - (fVar149 - fVar213) * 0.33333334) * fVar107;
  fStack_3a4 = (fVar174 - (fVar312 - fVar298) * 0.33333334) * fVar217 +
               (fVar134 - (fVar173 - fVar237) * 0.33333334) * fVar107;
  fStack_3a0 = (fVar177 - (fVar313 - fVar302) * 0.33333334) * fVar217 +
               (fVar135 - (fVar176 - fVar246) * 0.33333334) * fVar107;
  fStack_39c = (fVar179 - (fVar314 - fVar322) * 0.33333334) * fVar217 +
               (fVar147 - (fVar181 - fVar232) * 0.33333334) * fVar107;
  local_398 = fVar326 * fVar217 + fVar133 * fVar107;
  fStack_394 = fVar174 * fVar217 + fVar134 * fVar107;
  fStack_390 = fVar177 * fVar217 + fVar135 * fVar107;
  fStack_38c = fVar179 * fVar217 + fVar147 * fVar107;
  local_368 = fVar219 * fVar217 + fVar210 * fVar107;
  fStack_364 = fVar233 * fVar217 + fVar216 * fVar107;
  fStack_360 = fVar235 * fVar217 + fVar218 * fVar107;
  fStack_35c = fVar236 * fVar217 + fVar234 * fVar107;
  local_358 = ((fVar249 + fVar316) * 0.33333334 + fVar219) * fVar217 +
              ((fVar158 + fVar161) * 0.33333334 + fVar210) * fVar107;
  fStack_354 = ((fVar262 + fVar321) * 0.33333334 + fVar233) * fVar217 +
               ((fVar159 + fVar175) * 0.33333334 + fVar216) * fVar107;
  fStack_350 = ((fVar264 + fVar323) * 0.33333334 + fVar235) * fVar217 +
               ((fVar160 + fVar178) * 0.33333334 + fVar218) * fVar107;
  fStack_34c = ((fVar265 + fVar325) * 0.33333334 + fVar236) * fVar217 +
               ((fVar208 + fVar180) * 0.33333334 + fVar234) * fVar107;
  local_3cc.m128[1] =
       (fVar281 - (fVar287 + fVar303) * 0.33333334) * fVar217 +
       (fVar148 - (fVar213 + fVar149) * 0.33333334) * fVar107;
  local_3cc.m128[2] =
       (fVar286 - (fVar298 + fVar312) * 0.33333334) * fVar217 +
       (fVar69 - (fVar237 + fVar173) * 0.33333334) * fVar107;
  local_3cc.m128[3] =
       (fVar297 - (fVar302 + fVar313) * 0.33333334) * fVar217 +
       (fVar108 - (fVar246 + fVar176) * 0.33333334) * fVar107;
  fStack_3bc = (fVar301 - (fVar322 + fVar314) * 0.33333334) * fVar217 +
               (fVar109 - (fVar232 + fVar181) * 0.33333334) * fVar107;
  local_208 = fVar217 * fVar281 + fVar107 * fVar148;
  fStack_204 = fVar217 * fVar286 + fVar107 * fVar69;
  fStack_200 = fVar217 * fVar297 + fVar107 * fVar108;
  fStack_1fc = fVar217 * fVar301 + fVar107 * fVar109;
  fVar148 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar69 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar107 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar108 = (pre->ray_space).vx.field_0.m128[0];
  fVar109 = (pre->ray_space).vx.field_0.m128[1];
  fVar133 = (pre->ray_space).vy.field_0.m128[0];
  fVar134 = (pre->ray_space).vy.field_0.m128[1];
  fVar135 = (pre->ray_space).vz.field_0.m128[0];
  fVar147 = (pre->ray_space).vz.field_0.m128[1];
  fVar173 = (local_378 - fVar148) * fVar108 +
            (fStack_374 - fVar69) * fVar133 + (fStack_370 - fVar107) * fVar135;
  fVar176 = (local_378 - fVar148) * fVar109 +
            (fStack_374 - fVar69) * fVar134 + (fStack_370 - fVar107) * fVar147;
  local_298 = CONCAT44(fVar176,fVar173);
  fVar149 = (local_388 - fVar148) * fVar108 +
            (fStack_384 - fVar69) * fVar133 + (fStack_380 - fVar107) * fVar135;
  fVar158 = (local_388 - fVar148) * fVar109 +
            (fStack_384 - fVar69) * fVar134 + (fStack_380 - fVar107) * fVar147;
  local_2a8 = CONCAT44(fVar158,fVar149);
  fVar216 = (local_3a8 - fVar148) * fVar108 +
            (fStack_3a4 - fVar69) * fVar133 + (fStack_3a0 - fVar107) * fVar135;
  fVar217 = (local_3a8 - fVar148) * fVar109 +
            (fStack_3a4 - fVar69) * fVar134 + (fStack_3a0 - fVar107) * fVar147;
  local_2b8 = CONCAT44(fVar217,fVar216);
  fVar159 = (local_398 - fVar148) * fVar108 +
            (fStack_394 - fVar69) * fVar133 + (fStack_390 - fVar107) * fVar135;
  fVar160 = (local_398 - fVar148) * fVar109 +
            (fStack_394 - fVar69) * fVar134 + (fStack_390 - fVar107) * fVar147;
  local_2c8 = CONCAT44(fVar160,fVar159);
  afStack_1e8[0] =
       (local_368 - fVar148) * fVar108 +
       (fStack_364 - fVar69) * fVar133 + (fStack_360 - fVar107) * fVar135;
  afStack_1e8[1] =
       (local_368 - fVar148) * fVar109 +
       (fStack_364 - fVar69) * fVar134 + (fStack_360 - fVar107) * fVar147;
  fVar181 = (local_358 - fVar148) * fVar108 +
            (fStack_354 - fVar69) * fVar133 + (fStack_350 - fVar107) * fVar135;
  fVar208 = (local_358 - fVar148) * fVar109 +
            (fStack_354 - fVar69) * fVar134 + (fStack_350 - fVar107) * fVar147;
  local_2e8 = CONCAT44(fVar208,fVar181);
  fVar210 = (local_3cc.m128[1] - fVar148) * fVar108 +
            (local_3cc.m128[2] - fVar69) * fVar133 + (local_3cc.m128[3] - fVar107) * fVar135;
  fVar213 = (local_3cc.m128[1] - fVar148) * fVar109 +
            (local_3cc.m128[2] - fVar69) * fVar134 + (local_3cc.m128[3] - fVar107) * fVar147;
  fVar108 = (local_208 - fVar148) * fVar108 +
            (fStack_204 - fVar69) * fVar133 + (fStack_200 - fVar107) * fVar135;
  fVar148 = (local_208 - fVar148) * fVar109 +
            (fStack_204 - fVar69) * fVar134 + (fStack_200 - fVar107) * fVar147;
  local_308 = CONCAT44(fVar148,fVar108);
  auVar162._8_8_ = local_2e8;
  auVar162._0_8_ = local_2a8;
  register0x00001508 = local_308;
  local_328 = local_2c8;
  auVar90._8_4_ = afStack_1e8[0];
  auVar90._0_8_ = local_298;
  auVar90._12_4_ = afStack_1e8[1];
  auVar70 = minps(auVar90,auVar162);
  auVar121._8_4_ = fVar210;
  auVar121._0_8_ = local_2b8;
  auVar121._12_4_ = fVar213;
  auVar137 = minps(auVar121,_local_328);
  auVar70 = minps(auVar70,auVar137);
  auVar122._4_4_ = fVar176;
  auVar122._0_4_ = fVar173;
  auVar122._8_4_ = afStack_1e8[0];
  auVar122._12_4_ = afStack_1e8[1];
  auVar137 = maxps(auVar122,auVar162);
  auVar138._4_4_ = fVar217;
  auVar138._0_4_ = fVar216;
  auVar138._8_4_ = fVar210;
  auVar138._12_4_ = fVar213;
  auVar139 = maxps(auVar138,_local_328);
  auVar123 = maxps(auVar137,auVar139);
  auVar22._4_8_ = auVar139._8_8_;
  auVar22._0_4_ = auVar70._4_4_;
  auVar140._0_8_ = auVar22._0_8_ << 0x20;
  auVar140._8_4_ = auVar70._8_4_;
  auVar140._12_4_ = auVar70._12_4_;
  auVar141._8_8_ = auVar70._8_8_;
  auVar141._0_8_ = auVar140._8_8_;
  auVar137 = minps(auVar70,auVar141);
  auVar23._4_8_ = auVar70._8_8_;
  auVar23._0_4_ = auVar123._4_4_;
  auVar142._0_8_ = auVar23._0_8_ << 0x20;
  auVar142._8_4_ = auVar123._8_4_;
  auVar142._12_4_ = auVar123._12_4_;
  auVar143._8_8_ = auVar123._8_8_;
  auVar143._0_8_ = auVar142._8_8_;
  auVar70 = maxps(auVar123,auVar143);
  auVar91._0_8_ = auVar137._0_8_ & 0x7fffffff7fffffff;
  auVar91._8_4_ = auVar137._8_4_ & 0x7fffffff;
  auVar91._12_4_ = auVar137._12_4_ & 0x7fffffff;
  auVar124._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
  auVar124._8_4_ = auVar70._8_4_ & 0x7fffffff;
  auVar124._12_4_ = auVar70._12_4_ & 0x7fffffff;
  auVar70 = maxps(auVar91,auVar124);
  fStack_334 = auVar70._4_4_;
  local_338 = fStack_334;
  if (fStack_334 <= auVar70._0_4_) {
    local_338 = auVar70._0_4_;
  }
  lVar59 = (ulong)uVar62 + 0xf;
  local_338 = local_338 * 9.536743e-07;
  register0x00001488 = local_298;
  register0x00001388 = local_2a8;
  register0x000015c8 = local_2b8;
  register0x000013c8 = local_2c8;
  register0x00001548 = local_2e8;
  register0x00001348 = local_308;
  fStack_330 = fStack_334;
  fStack_32c = fStack_334;
  local_138 = local_338;
  fStack_134 = local_338;
  fStack_130 = local_338;
  fStack_12c = local_338;
  local_148 = -local_338;
  fStack_144 = -local_338;
  fStack_140 = -local_338;
  fStack_13c = -local_338;
  local_1f8 = local_298;
  local_88 = fVar149 - fVar173;
  fStack_84 = fVar158 - fVar176;
  fStack_80 = fVar181 - afStack_1e8[0];
  fStack_7c = fVar208 - afStack_1e8[1];
  local_98 = fVar216 - fVar149;
  fStack_94 = fVar217 - fVar158;
  fStack_90 = fVar210 - fVar181;
  fStack_8c = fVar213 - fVar208;
  local_a8 = fVar159 - fVar216;
  fStack_a4 = fVar160 - fVar217;
  fStack_a0 = fVar108 - fVar210;
  fStack_9c = fVar148 - fVar213;
  local_168 = local_368 - local_378;
  fStack_164 = fStack_364 - fStack_374;
  fStack_160 = fStack_360 - fStack_370;
  fStack_15c = fStack_35c - fStack_36c;
  local_178 = local_358 - local_388;
  fStack_174 = fStack_354 - fStack_384;
  fStack_170 = fStack_350 - fStack_380;
  fStack_16c = fStack_34c - fStack_37c;
  local_188 = local_3cc.m128[1] - local_3a8;
  fStack_184 = local_3cc.m128[2] - fStack_3a4;
  fStack_180 = local_3cc.m128[3] - fStack_3a0;
  fStack_17c = fStack_3bc - fStack_39c;
  local_198 = local_208 - local_398;
  fStack_194 = fStack_204 - fStack_394;
  fStack_190 = fStack_200 - fStack_390;
  fStack_18c = fStack_1fc - fStack_38c;
  uVar60 = 0;
  fVar148 = 0.0;
  fVar69 = 1.0;
  fVar107 = 0.0;
  fVar108 = 1.0;
  fStack_3b0 = 0.0;
  fStack_3ac = 0.0;
  local_2d8 = afStack_1e8[0];
  fStack_2d4 = afStack_1e8[1];
  fStack_2d0 = afStack_1e8[0];
  fStack_2cc = afStack_1e8[1];
  local_2f8 = fVar210;
  fStack_2f4 = fVar213;
  fStack_2f0 = fVar210;
  fStack_2ec = fVar213;
LAB_00b4f4e3:
  do {
    fVar109 = 1.0 - fVar148;
    fVar133 = 1.0 - fVar148;
    fVar134 = 1.0 - fVar69;
    fVar135 = 1.0 - fVar69;
    fVar261 = local_298._0_4_ * fVar109 + local_2d8 * fVar148;
    fVar266 = local_298._4_4_ * fVar133 + fStack_2d4 * fVar148;
    fVar278 = local_298._8_4_ * fVar134 + fStack_2d0 * fVar69;
    fVar299 = local_298._12_4_ * fVar135 + fStack_2cc * fVar69;
    fVar158 = local_2a8._0_4_ * fVar109 + local_2e8._0_4_ * fVar148;
    fVar237 = local_2a8._4_4_ * fVar133 + local_2e8._4_4_ * fVar148;
    fVar246 = local_2a8._8_4_ * fVar134 + local_2e8._8_4_ * fVar69;
    fVar247 = local_2a8._12_4_ * fVar135 + local_2e8._12_4_ * fVar69;
    fVar323 = local_2b8._0_4_ * fVar109 + local_2f8 * fVar148;
    fVar325 = local_2b8._4_4_ * fVar133 + fStack_2f4 * fVar148;
    fVar287 = local_2b8._8_4_ * fVar134 + fStack_2f0 * fVar69;
    fVar298 = local_2b8._12_4_ * fVar135 + fStack_2ec * fVar69;
    fVar281 = fVar109 * local_2c8._0_4_ + fVar148 * local_308._0_4_;
    fVar286 = fVar133 * local_2c8._4_4_ + fVar148 * local_308._4_4_;
    fVar303 = fVar134 * local_2c8._8_4_ + fVar69 * local_308._8_4_;
    fVar312 = fVar135 * local_2c8._12_4_ + fVar69 * local_308._12_4_;
    fVar313 = (fVar108 - fVar107) * 0.11111111;
    local_3b8 = CONCAT44(fVar108,fVar107);
    fVar314 = (fVar108 - fVar107) * 0.0 + fVar107;
    fVar316 = (fVar108 - fVar107) * 0.33333334 + fVar107;
    fVar321 = (fVar108 - fVar107) * 0.6666667 + fVar107;
    fVar107 = (fVar108 - fVar107) * 1.0 + fVar107;
    fVar108 = 1.0 - fVar314;
    fVar109 = 1.0 - fVar316;
    fVar133 = 1.0 - fVar321;
    fVar149 = 1.0 - fVar107;
    fVar159 = fVar158 * fVar108 + fVar323 * fVar314;
    fVar160 = fVar158 * fVar109 + fVar323 * fVar316;
    fVar173 = fVar158 * fVar133 + fVar323 * fVar321;
    fVar176 = fVar158 * fVar149 + fVar323 * fVar107;
    fVar218 = fVar237 * fVar108 + fVar325 * fVar314;
    fVar232 = fVar237 * fVar109 + fVar325 * fVar316;
    fVar234 = fVar237 * fVar133 + fVar325 * fVar321;
    fVar248 = fVar237 * fVar149 + fVar325 * fVar107;
    fVar134 = (fVar261 * fVar108 + fVar158 * fVar314) * fVar108 + fVar314 * fVar159;
    fVar135 = (fVar261 * fVar109 + fVar158 * fVar316) * fVar109 + fVar316 * fVar160;
    fVar147 = (fVar261 * fVar133 + fVar158 * fVar321) * fVar133 + fVar321 * fVar173;
    fVar158 = (fVar261 * fVar149 + fVar158 * fVar107) * fVar149 + fVar107 * fVar176;
    fVar261 = (fVar266 * fVar108 + fVar237 * fVar314) * fVar108 + fVar314 * fVar218;
    fVar263 = (fVar266 * fVar109 + fVar237 * fVar316) * fVar109 + fVar316 * fVar232;
    fVar315 = (fVar266 * fVar133 + fVar237 * fVar321) * fVar133 + fVar321 * fVar234;
    fVar237 = (fVar266 * fVar149 + fVar237 * fVar107) * fVar149 + fVar107 * fVar248;
    fVar159 = fVar159 * fVar108 + (fVar323 * fVar108 + fVar281 * fVar314) * fVar314;
    fVar160 = fVar160 * fVar109 + (fVar323 * fVar109 + fVar281 * fVar316) * fVar316;
    fVar173 = fVar173 * fVar133 + (fVar323 * fVar133 + fVar281 * fVar321) * fVar321;
    fVar176 = fVar176 * fVar149 + (fVar323 * fVar149 + fVar281 * fVar107) * fVar107;
    fVar218 = fVar218 * fVar108 + (fVar325 * fVar108 + fVar286 * fVar314) * fVar314;
    fVar232 = fVar232 * fVar109 + (fVar325 * fVar109 + fVar286 * fVar316) * fVar316;
    fVar234 = fVar234 * fVar133 + (fVar325 * fVar133 + fVar286 * fVar321) * fVar321;
    fVar248 = fVar248 * fVar149 + (fVar325 * fVar149 + fVar286 * fVar107) * fVar107;
    local_248 = fVar108 * fVar134 + fVar314 * fVar159;
    fStack_244 = fVar109 * fVar135 + fVar316 * fVar160;
    fStack_240 = fVar133 * fVar147 + fVar321 * fVar173;
    fStack_23c = fVar149 * fVar158 + fVar107 * fVar176;
    local_128 = fVar108 * fVar261 + fVar314 * fVar218;
    fStack_124 = fVar109 * fVar263 + fVar316 * fVar232;
    fStack_120 = fVar133 * fVar315 + fVar321 * fVar234;
    fStack_11c = fVar149 * fVar237 + fVar107 * fVar248;
    fVar135 = (fVar160 - fVar135) * 3.0 * fVar313;
    fVar147 = (fVar173 - fVar147) * 3.0 * fVar313;
    fVar158 = (fVar176 - fVar158) * 3.0 * fVar313;
    fVar160 = (fVar232 - fVar263) * 3.0 * fVar313;
    fVar173 = (fVar234 - fVar315) * 3.0 * fVar313;
    fVar176 = (fVar248 - fVar237) * 3.0 * fVar313;
    local_218._4_4_ = fStack_240;
    local_218._0_4_ = fStack_244;
    local_218._8_4_ = fStack_23c;
    local_218._12_4_ = 0;
    local_c8._4_4_ = fStack_120;
    local_c8._0_4_ = fStack_124;
    local_228 = local_248 + (fVar159 - fVar134) * 3.0 * fVar313;
    fStack_224 = fStack_244 + fVar135;
    fStack_220 = fStack_240 + fVar147;
    fStack_21c = fStack_23c + fVar158;
    local_348._0_4_ = local_128 + (fVar218 - fVar261) * 3.0 * fVar313;
    local_348._4_4_ = fStack_124 + fVar160;
    fStack_340 = fStack_120 + fVar173;
    fStack_33c = fStack_11c + fVar176;
    local_238._0_4_ = fStack_244 - fVar135;
    local_238._4_4_ = fStack_240 - fVar147;
    local_238._8_4_ = fStack_23c - fVar158;
    local_238._12_4_ = 0;
    auVar92._0_4_ = fStack_124 - fVar160;
    auVar92._4_4_ = fStack_120 - fVar173;
    auVar92._8_4_ = fStack_11c - fVar176;
    auVar92._12_4_ = 0;
    fVar134 = fVar246 * fVar108 + fVar287 * fVar314;
    fVar135 = fVar246 * fVar109 + fVar287 * fVar316;
    fVar147 = fVar246 * fVar133 + fVar287 * fVar321;
    fVar158 = fVar246 * fVar149 + fVar287 * fVar107;
    fVar159 = fVar247 * fVar108 + fVar298 * fVar314;
    fVar160 = fVar247 * fVar109 + fVar298 * fVar316;
    fVar173 = fVar247 * fVar133 + fVar298 * fVar321;
    fVar266 = fVar247 * fVar149 + fVar298 * fVar107;
    fVar176 = (fVar278 * fVar108 + fVar246 * fVar314) * fVar108 + fVar314 * fVar134;
    fVar218 = (fVar278 * fVar109 + fVar246 * fVar316) * fVar109 + fVar316 * fVar135;
    fVar232 = (fVar278 * fVar133 + fVar246 * fVar321) * fVar133 + fVar321 * fVar147;
    fVar234 = (fVar278 * fVar149 + fVar246 * fVar107) * fVar149 + fVar107 * fVar158;
    fVar278 = (fVar299 * fVar108 + fVar247 * fVar314) * fVar108 + fVar314 * fVar159;
    fVar281 = (fVar299 * fVar109 + fVar247 * fVar316) * fVar109 + fVar316 * fVar160;
    fVar286 = (fVar299 * fVar133 + fVar247 * fVar321) * fVar133 + fVar321 * fVar173;
    fVar299 = (fVar299 * fVar149 + fVar247 * fVar107) * fVar149 + fVar107 * fVar266;
    fVar248 = fVar134 * fVar108 + (fVar287 * fVar108 + fVar303 * fVar314) * fVar314;
    fVar261 = fVar135 * fVar109 + (fVar287 * fVar109 + fVar303 * fVar316) * fVar316;
    fVar263 = fVar147 * fVar133 + (fVar287 * fVar133 + fVar303 * fVar321) * fVar321;
    fVar315 = fVar158 * fVar149 + (fVar287 * fVar149 + fVar303 * fVar107) * fVar107;
    fVar237 = fVar159 * fVar108 + (fVar298 * fVar108 + fVar312 * fVar314) * fVar314;
    fVar246 = fVar160 * fVar109 + (fVar298 * fVar109 + fVar312 * fVar316) * fVar316;
    fVar247 = fVar173 * fVar133 + (fVar298 * fVar133 + fVar312 * fVar321) * fVar321;
    fVar266 = fVar266 * fVar149 + (fVar298 * fVar149 + fVar312 * fVar107) * fVar107;
    fVar158 = fVar108 * fVar176 + fVar314 * fVar248;
    fVar159 = fVar109 * fVar218 + fVar316 * fVar261;
    fVar160 = fVar133 * fVar232 + fVar321 * fVar263;
    fVar173 = fVar149 * fVar234 + fVar107 * fVar315;
    fVar134 = fVar108 * fVar278 + fVar314 * fVar237;
    fVar135 = fVar109 * fVar281 + fVar316 * fVar246;
    fVar147 = fVar133 * fVar286 + fVar321 * fVar247;
    fVar149 = fVar149 * fVar299 + fVar107 * fVar266;
    fVar107 = (fVar261 - fVar218) * 3.0 * fVar313;
    fVar108 = (fVar263 - fVar232) * 3.0 * fVar313;
    fVar109 = (fVar315 - fVar234) * 3.0 * fVar313;
    fVar133 = (fVar246 - fVar281) * 3.0 * fVar313;
    fVar218 = (fVar247 - fVar286) * 3.0 * fVar313;
    fVar232 = (fVar266 - fVar299) * 3.0 * fVar313;
    local_d8._4_4_ = fVar160;
    local_d8._0_4_ = fVar159;
    local_d8._8_4_ = fVar173;
    local_d8._12_4_ = 0;
    local_f8._4_4_ = fVar147;
    local_f8._0_4_ = fVar135;
    local_f8._8_4_ = fVar149;
    local_f8._12_4_ = 0;
    local_118 = fVar158 + (fVar248 - fVar176) * 3.0 * fVar313;
    fStack_114 = fVar159 + fVar107;
    fStack_110 = fVar160 + fVar108;
    fStack_10c = fVar173 + fVar109;
    local_e8 = fVar134 + (fVar237 - fVar278) * 3.0 * fVar313;
    fStack_e4 = fVar135 + fVar133;
    fStack_e0 = fVar147 + fVar218;
    fStack_dc = fVar149 + fVar232;
    local_b8._0_4_ = fVar159 - fVar107;
    local_b8._4_4_ = fVar160 - fVar108;
    local_b8._8_4_ = fVar173 - fVar109;
    local_b8._12_4_ = 0;
    local_108._0_4_ = fVar135 - fVar133;
    local_108._4_4_ = fVar147 - fVar218;
    local_108._8_4_ = fVar149 - fVar232;
    local_108._12_4_ = 0;
    fVar107 = (fVar159 - fStack_244) + (fVar158 - local_248);
    fVar108 = (fVar160 - fStack_240) + (fVar159 - fStack_244);
    fVar109 = (fVar173 - fStack_23c) + (fVar160 - fStack_240);
    fVar133 = (fVar173 - fStack_23c) + 0.0;
    local_c8._8_4_ = fStack_11c;
    local_c8._12_4_ = 0;
    fVar176 = (fVar135 - fStack_124) + (fVar134 - local_128);
    fVar218 = (fVar147 - fStack_120) + (fVar135 - fStack_124);
    fVar232 = (fVar149 - fStack_11c) + (fVar147 - fStack_120);
    fVar234 = (fVar149 - fStack_11c) + 0.0;
    auVar225._0_8_ =
         CONCAT44(fStack_124 * fVar108 - fStack_244 * fVar218,
                  local_128 * fVar107 - local_248 * fVar176);
    auVar225._8_4_ = fStack_120 * fVar109 - fStack_240 * fVar232;
    auVar225._12_4_ = fStack_11c * fVar133 - fStack_23c * fVar234;
    auVar163._0_4_ = (float)local_348._0_4_ * fVar107 - local_228 * fVar176;
    auVar163._4_4_ = (float)local_348._4_4_ * fVar108 - fStack_224 * fVar218;
    auVar163._8_4_ = fStack_340 * fVar109 - fStack_220 * fVar232;
    auVar163._12_4_ = fStack_33c * fVar133 - fStack_21c * fVar234;
    auVar199._0_8_ =
         CONCAT44(auVar92._4_4_ * fVar108 - fVar218 * local_238._4_4_,
                  auVar92._0_4_ * fVar107 - fVar176 * local_238._0_4_);
    auVar199._8_4_ = auVar92._8_4_ * fVar109 - fVar232 * local_238._8_4_;
    auVar199._12_4_ = fVar133 * 0.0 - fVar234 * 0.0;
    auVar309._0_4_ = fVar107 * fStack_124 - fVar176 * fStack_244;
    auVar309._4_4_ = fVar108 * fStack_120 - fVar218 * fStack_240;
    auVar309._8_4_ = fVar109 * fStack_11c - fVar232 * fStack_23c;
    auVar309._12_4_ = fVar133 * 0.0 - fVar234 * 0.0;
    auVar254._0_8_ =
         CONCAT44(fVar135 * fVar108 - fVar159 * fVar218,fVar134 * fVar107 - fVar158 * fVar176);
    auVar254._8_4_ = fVar147 * fVar109 - fVar160 * fVar232;
    auVar254._12_4_ = fVar149 * fVar133 - fVar173 * fVar234;
    auVar319._0_4_ = local_e8 * fVar107 - local_118 * fVar176;
    auVar319._4_4_ = fStack_e4 * fVar108 - fStack_114 * fVar218;
    auVar319._8_4_ = fStack_e0 * fVar109 - fStack_110 * fVar232;
    auVar319._12_4_ = fStack_dc * fVar133 - fStack_10c * fVar234;
    auVar238._0_8_ =
         CONCAT44(local_108._4_4_ * fVar108 - fVar218 * local_b8._4_4_,
                  local_108._0_4_ * fVar107 - fVar176 * local_b8._0_4_);
    auVar238._8_4_ = local_108._8_4_ * fVar109 - fVar232 * local_b8._8_4_;
    auVar238._12_4_ = fVar133 * 0.0 - fVar234 * 0.0;
    auVar93._0_4_ = fVar107 * fVar135 - fVar176 * fVar159;
    auVar93._4_4_ = fVar108 * fVar147 - fVar218 * fVar160;
    auVar93._8_4_ = fVar109 * fVar149 - fVar232 * fVar173;
    auVar93._12_4_ = fVar133 * 0.0 - fVar234 * 0.0;
    auVar125._8_4_ = auVar225._8_4_;
    auVar125._0_8_ = auVar225._0_8_;
    auVar125._12_4_ = auVar225._12_4_;
    auVar70 = minps(auVar125,auVar163);
    auVar123 = maxps(auVar225,auVar163);
    auVar164._8_4_ = auVar199._8_4_;
    auVar164._0_8_ = auVar199._0_8_;
    auVar164._12_4_ = auVar199._12_4_;
    auVar137 = minps(auVar164,auVar309);
    auVar70 = minps(auVar70,auVar137);
    auVar137 = maxps(auVar199,auVar309);
    auVar139 = maxps(auVar123,auVar137);
    auVar165._8_4_ = auVar254._8_4_;
    auVar165._0_8_ = auVar254._0_8_;
    auVar165._12_4_ = auVar254._12_4_;
    auVar137 = minps(auVar165,auVar319);
    auVar255 = maxps(auVar254,auVar319);
    auVar200._8_4_ = auVar238._8_4_;
    auVar200._0_8_ = auVar238._0_8_;
    auVar200._12_4_ = auVar238._12_4_;
    auVar123 = minps(auVar200,auVar93);
    auVar137 = minps(auVar137,auVar123);
    auVar70 = minps(auVar70,auVar137);
    auVar137 = maxps(auVar238,auVar93);
    auVar137 = maxps(auVar255,auVar137);
    auVar137 = maxps(auVar139,auVar137);
    auVar226._0_4_ =
         -(uint)(local_148 <= auVar137._0_4_ && auVar70._0_4_ <= local_138) & local_158._0_4_;
    auVar226._4_4_ =
         -(uint)(fStack_144 <= auVar137._4_4_ && auVar70._4_4_ <= fStack_134) & local_158._4_4_;
    auVar226._8_4_ =
         -(uint)(fStack_140 <= auVar137._8_4_ && auVar70._8_4_ <= fStack_130) & local_158._8_4_;
    auVar226._12_4_ =
         -(uint)(fStack_13c <= auVar137._12_4_ && auVar70._12_4_ <= fStack_12c) & local_158._12_4_;
    uVar66 = movmskps((int)uVar55,auVar226);
    paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar66;
    if (uVar66 != 0) {
      fVar107 = (fVar159 - fVar158) + (fStack_244 - local_248);
      fVar108 = (fVar160 - fVar159) + (fStack_240 - fStack_244);
      fVar109 = (fVar173 - fVar160) + (fStack_23c - fStack_240);
      fVar133 = (0.0 - fVar173) + (0.0 - fStack_23c);
      fVar176 = (fVar135 - fVar134) + (fStack_124 - local_128);
      fVar218 = (fVar147 - fVar135) + (fStack_120 - fStack_124);
      fVar232 = (fVar149 - fVar147) + (fStack_11c - fStack_120);
      fVar234 = (0.0 - fVar149) + (0.0 - fStack_11c);
      auVar327._0_8_ =
           CONCAT44(fStack_124 * fVar108 - fStack_244 * fVar218,
                    local_128 * fVar107 - local_248 * fVar176);
      auVar327._8_4_ = fStack_120 * fVar109 - fStack_240 * fVar232;
      auVar327._12_4_ = fStack_11c * fVar133 - fStack_23c * fVar234;
      auVar166._0_4_ = (float)local_348._0_4_ * fVar107 - local_228 * fVar176;
      auVar166._4_4_ = (float)local_348._4_4_ * fVar108 - fStack_224 * fVar218;
      auVar166._8_4_ = fStack_340 * fVar109 - fStack_220 * fVar232;
      auVar166._12_4_ = fStack_33c * fVar133 - fStack_21c * fVar234;
      auVar239._0_8_ =
           CONCAT44(auVar92._4_4_ * fVar108 - local_238._4_4_ * fVar218,
                    auVar92._0_4_ * fVar107 - local_238._0_4_ * fVar176);
      auVar239._8_4_ = auVar92._8_4_ * fVar109 - local_238._8_4_ * fVar232;
      auVar239._12_4_ = fVar133 * 0.0 - fVar234 * 0.0;
      auVar201._0_4_ = fStack_124 * fVar107 - fStack_244 * fVar176;
      auVar201._4_4_ = fStack_120 * fVar108 - fStack_240 * fVar218;
      auVar201._8_4_ = fStack_11c * fVar109 - fStack_23c * fVar232;
      auVar201._12_4_ = fVar133 * 0.0 - fVar234 * 0.0;
      auVar144._0_8_ =
           CONCAT44(fVar135 * fVar108 - fVar159 * fVar218,fVar134 * fVar107 - fVar158 * fVar176);
      auVar144._8_4_ = fVar147 * fVar109 - fVar160 * fVar232;
      auVar144._12_4_ = fVar149 * fVar133 - fVar173 * fVar234;
      auVar273._0_4_ = local_e8 * fVar107 - local_118 * fVar176;
      auVar273._4_4_ = fStack_e4 * fVar108 - fStack_114 * fVar218;
      auVar273._8_4_ = fStack_e0 * fVar109 - fStack_110 * fVar232;
      auVar273._12_4_ = fStack_dc * fVar133 - fStack_10c * fVar234;
      auVar310._0_8_ =
           CONCAT44(local_108._4_4_ * fVar108 - local_b8._4_4_ * fVar218,
                    local_108._0_4_ * fVar107 - local_b8._0_4_ * fVar176);
      auVar310._8_4_ = local_108._8_4_ * fVar109 - local_b8._8_4_ * fVar232;
      auVar310._12_4_ = fVar133 * 0.0 - fVar234 * 0.0;
      auVar94._0_4_ = fVar107 * fVar135 - fVar176 * fVar159;
      auVar94._4_4_ = fVar108 * fVar147 - fVar218 * fVar160;
      auVar94._8_4_ = fVar109 * fVar149 - fVar232 * fVar173;
      auVar94._12_4_ = fVar133 * 0.0 - fVar234 * 0.0;
      auVar126._8_4_ = auVar327._8_4_;
      auVar126._0_8_ = auVar327._0_8_;
      auVar126._12_4_ = auVar327._12_4_;
      auVar70 = minps(auVar126,auVar166);
      auVar123 = maxps(auVar327,auVar166);
      auVar167._8_4_ = auVar239._8_4_;
      auVar167._0_8_ = auVar239._0_8_;
      auVar167._12_4_ = auVar239._12_4_;
      auVar137 = minps(auVar167,auVar201);
      auVar70 = minps(auVar70,auVar137);
      auVar137 = maxps(auVar239,auVar201);
      auVar255 = maxps(auVar123,auVar137);
      auVar168._8_4_ = auVar144._8_4_;
      auVar168._0_8_ = auVar144._0_8_;
      auVar168._12_4_ = auVar144._12_4_;
      auVar123 = minps(auVar168,auVar273);
      auVar137 = maxps(auVar144,auVar273);
      auVar202._8_4_ = auVar310._8_4_;
      auVar202._0_8_ = auVar310._0_8_;
      auVar202._12_4_ = auVar310._12_4_;
      auVar139 = minps(auVar202,auVar94);
      auVar123 = minps(auVar123,auVar139);
      auVar70 = minps(auVar70,auVar123);
      auVar123 = maxps(auVar310,auVar94);
      auVar137 = maxps(auVar137,auVar123);
      auVar137 = maxps(auVar255,auVar137);
      auVar328._0_4_ =
           -(uint)(local_148 <= auVar137._0_4_ && auVar70._0_4_ <= local_138) & auVar226._0_4_;
      auVar328._4_4_ =
           -(uint)(fStack_144 <= auVar137._4_4_ && auVar70._4_4_ <= fStack_134) & auVar226._4_4_;
      auVar328._8_4_ =
           -(uint)(fStack_140 <= auVar137._8_4_ && auVar70._8_4_ <= fStack_130) & auVar226._8_4_;
      auVar328._12_4_ =
           -(uint)(fStack_13c <= auVar137._12_4_ && auVar70._12_4_ <= fStack_12c) & auVar226._12_4_;
      uVar66 = movmskps(uVar66,auVar328);
      paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar66;
      auVar319 = local_f8;
      if (uVar66 != 0) {
        afStack_1e8[uVar60] = (float)(uVar66 & 0xff);
        *(long *)(afStack_78 + uVar60 * 2) = local_3b8;
        *(ulong *)(afStack_58 + uVar60 * 2) = CONCAT44(fVar69,fVar148);
        uVar60 = (ulong)((int)uVar60 + 1);
        paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)(byte)uVar66;
      }
    }
LAB_00b4fb50:
    _local_418 = auVar92;
    auVar70 = _local_418;
    if ((int)uVar60 == 0) {
      fVar148 = (ray->super_RayK<1>).tfar;
      auVar132._4_4_ = -(uint)(fStack_1a4 <= fVar148);
      auVar132._0_4_ = -(uint)(local_1a8 <= fVar148);
      auVar132._8_4_ = -(uint)(fStack_1a0 <= fVar148);
      auVar132._12_4_ = -(uint)(fStack_19c <= fVar148);
      uVar64 = movmskps((int)paVar56,auVar132);
      uVar62 = uVar62 & (uint)lVar59 & uVar64;
      if (uVar62 == 0) {
        return;
      }
      goto LAB_00b4e756;
    }
    uVar66 = (int)uVar60 - 1;
    uVar55 = (ulong)uVar66;
    fVar107 = afStack_1e8[uVar55];
    fVar148 = afStack_58[uVar55 * 2];
    fVar69 = afStack_58[uVar55 * 2 + 1];
    uVar6 = 0;
    if (fVar107 != 0.0) {
      for (; ((uint)fVar107 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
      }
    }
    fVar107 = (float)((int)fVar107 - 1U & (uint)fVar107);
    afStack_1e8[uVar55] = fVar107;
    if (fVar107 == 0.0) {
      uVar60 = (ulong)uVar66;
    }
    fVar108 = (float)(uVar6 + 1) * 0.33333334;
    fVar109 = afStack_78[uVar55 * 2];
    fVar133 = afStack_78[uVar55 * 2 + 1];
    fVar107 = fVar109 * (1.0 - (float)uVar6 * 0.33333334) + fVar133 * (float)uVar6 * 0.33333334;
    fVar108 = fVar109 * (1.0 - fVar108) + fVar133 * fVar108;
    fStack_3b0 = fVar109 * 0.0 + fVar133 * 0.0;
    fStack_3ac = fVar109 * 0.0 + fVar133 * 0.0;
    fVar109 = fVar108 - fVar107;
    if (fVar109 < 0.16666667) {
      fVar173 = 1.0 - fVar148;
      fVar176 = 1.0 - fVar148;
      fVar232 = 1.0 - fVar69;
      fVar234 = 1.0 - fVar69;
      fVar135 = (float)local_298._0_4_ * fVar173 + local_2d8 * fVar148;
      fVar149 = (float)local_298._4_4_ * fVar176 + fStack_2d4 * fVar148;
      fVar159 = fStack_290 * fVar232 + fStack_2d0 * fVar69;
      fVar160 = fStack_28c * fVar234 + fStack_2cc * fVar69;
      fVar133 = (float)local_2a8._0_4_ * fVar173 + (float)local_2e8._0_4_ * fVar148;
      fVar134 = (float)local_2a8._4_4_ * fVar176 + (float)local_2e8._4_4_ * fVar148;
      fVar147 = fStack_2a0 * fVar232 + fStack_2e0 * fVar69;
      fVar158 = fStack_29c * fVar234 + fStack_2dc * fVar69;
      fVar261 = (float)local_2b8._0_4_ * fVar173 + local_2f8 * fVar148;
      fVar315 = (float)local_2b8._4_4_ * fVar176 + fStack_2f4 * fVar148;
      fVar246 = fStack_2b0 * fVar232 + fStack_2f0 * fVar69;
      fVar266 = fStack_2ac * fVar234 + fStack_2ec * fVar69;
      local_3b8 = CONCAT44(fVar108,fVar107);
      fVar218 = (fVar173 * (float)local_2c8._0_4_ + fVar148 * (float)local_308._0_4_) - fVar261;
      fVar148 = (fVar176 * (float)local_2c8._4_4_ + fVar148 * (float)local_308._4_4_) - fVar315;
      fVar232 = (fVar232 * fStack_2c0 + fVar69 * fStack_300) - fVar246;
      fVar234 = (fVar234 * fStack_2bc + fVar69 * fStack_2fc) - fVar266;
      fVar69 = fVar107 * (fVar261 - fVar133) + fVar133;
      fVar173 = fVar107 * (fVar315 - fVar134) + fVar134;
      fVar176 = fVar107 * (fVar246 - fVar147) + fVar147;
      fVar248 = fVar107 * (fVar266 - fVar158) + fVar158;
      fVar263 = (fVar261 - fVar133) * fVar108 + fVar133;
      fVar237 = (fVar315 - fVar134) * fVar108 + fVar134;
      fVar247 = (fVar246 - fVar147) * fVar108 + fVar147;
      fVar278 = (fVar266 - fVar158) * fVar108 + fVar158;
      fVar281 = fVar107 * (fVar133 - fVar135) + fVar135;
      fVar286 = fVar107 * (fVar134 - fVar149) + fVar149;
      fVar299 = fVar107 * (fVar147 - fVar159) + fVar159;
      fVar303 = fVar107 * (fVar158 - fVar160) + fVar160;
      fVar281 = (fVar69 - fVar281) * fVar107 + fVar281;
      fVar286 = (fVar173 - fVar286) * fVar107 + fVar286;
      fVar299 = (fVar176 - fVar299) * fVar107 + fVar299;
      fVar303 = (fVar248 - fVar303) * fVar107 + fVar303;
      fVar69 = (((fVar107 * fVar218 + fVar261) - fVar69) * fVar107 + fVar69) - fVar281;
      fVar173 = (((fVar107 * fVar148 + fVar315) - fVar173) * fVar107 + fVar173) - fVar286;
      fVar176 = (((fVar107 * fVar232 + fVar246) - fVar176) * fVar107 + fVar176) - fVar299;
      fVar248 = (((fVar107 * fVar234 + fVar266) - fVar248) * fVar107 + fVar248) - fVar303;
      auVar145._0_4_ = fVar107 * fVar69 + fVar281;
      auVar145._4_4_ = fVar107 * fVar173 + fVar286;
      auVar145._8_4_ = fVar107 * fVar176 + fVar299;
      auVar145._12_4_ = fVar107 * fVar248 + fVar303;
      fVar135 = (fVar133 - fVar135) * fVar108 + fVar135;
      fVar149 = (fVar134 - fVar149) * fVar108 + fVar149;
      fVar159 = (fVar147 - fVar159) * fVar108 + fVar159;
      fVar160 = (fVar158 - fVar160) * fVar108 + fVar160;
      fVar135 = (fVar263 - fVar135) * fVar108 + fVar135;
      fVar149 = (fVar237 - fVar149) * fVar108 + fVar149;
      fVar159 = (fVar247 - fVar159) * fVar108 + fVar159;
      fVar160 = (fVar278 - fVar160) * fVar108 + fVar160;
      fVar133 = (((fVar218 * fVar108 + fVar261) - fVar263) * fVar108 + fVar263) - fVar135;
      fVar134 = (((fVar148 * fVar108 + fVar315) - fVar237) * fVar108 + fVar237) - fVar149;
      fVar147 = (((fVar232 * fVar108 + fVar246) - fVar247) * fVar108 + fVar247) - fVar159;
      fVar158 = (((fVar234 * fVar108 + fVar266) - fVar278) * fVar108 + fVar278) - fVar160;
      fVar135 = fVar108 * fVar133 + fVar135;
      fVar149 = fVar108 * fVar134 + fVar149;
      fVar159 = fVar108 * fVar147 + fVar159;
      fVar160 = fVar108 * fVar158 + fVar160;
      fVar148 = fVar109 * 0.33333334;
      fVar218 = fVar69 * (float)DAT_01f7ff50 * fVar148 + auVar145._0_4_;
      fVar232 = fVar173 * DAT_01f7ff50._4_4_ * fVar148 + auVar145._4_4_;
      fVar234 = fVar176 * DAT_01f7ff50._8_4_ * fVar148 + auVar145._8_4_;
      fVar248 = fVar248 * DAT_01f7ff50._12_4_ * fVar148 + auVar145._12_4_;
      fVar261 = fVar135 - fVar148 * fVar133 * (float)DAT_01f7ff50;
      fVar263 = fVar149 - fVar148 * fVar134 * DAT_01f7ff50._4_4_;
      fVar315 = fVar159 - fVar148 * fVar147 * DAT_01f7ff50._8_4_;
      fVar237 = fVar160 - fVar148 * fVar158 * DAT_01f7ff50._12_4_;
      auVar24._4_8_ = auVar319._8_8_;
      auVar24._0_4_ = auVar145._4_4_;
      auVar318._0_8_ = auVar24._0_8_ << 0x20;
      auVar318._8_4_ = auVar145._8_4_;
      auVar318._12_4_ = auVar145._12_4_;
      auVar319._8_8_ = auVar145._8_8_;
      auVar319._0_8_ = auVar318._8_8_;
      auVar25._4_8_ = DAT_01f7ff50._8_8_;
      auVar25._0_4_ = fVar149;
      auVar240._0_8_ = auVar25._0_8_ << 0x20;
      auVar240._8_4_ = fVar159;
      auVar240._12_4_ = fVar160;
      fVar147 = (fVar159 - fVar135) + (auVar145._8_4_ - auVar145._0_4_);
      fVar158 = (fVar160 - fVar149) + (auVar145._12_4_ - auVar145._4_4_);
      auVar256._0_4_ = fVar263 * fVar158;
      auVar256._4_4_ = fVar263 * fVar158;
      auVar256._8_4_ = fVar237 * fVar158;
      auVar256._12_4_ = fVar237 * fVar158;
      fVar148 = auVar145._0_4_ * fVar147 + auVar145._4_4_ * fVar158;
      fVar69 = auVar145._8_4_ * fVar147 + auVar145._12_4_ * fVar158;
      fVar173 = fVar218 * fVar147 + fVar232 * fVar158;
      fVar176 = fVar234 * fVar147 + fVar248 * fVar158;
      fVar246 = fVar261 * fVar147 + auVar256._0_4_;
      auVar227._0_8_ = CONCAT44(fVar263 * fVar147 + auVar256._4_4_,fVar246);
      auVar227._8_4_ = fVar315 * fVar147 + auVar256._8_4_;
      auVar227._12_4_ = fVar237 * fVar147 + auVar256._12_4_;
      fVar134 = fVar147 * fVar135 + fVar158 * fVar149;
      fVar247 = fVar147 * fVar159 + fVar158 * fVar160;
      auVar26._4_8_ = auVar256._8_8_;
      auVar26._0_4_ = fVar232 * fVar147 + fVar232 * fVar158;
      auVar257._0_8_ = auVar26._0_8_ << 0x20;
      auVar257._8_4_ = fVar176;
      auVar257._12_4_ = fVar248 * fVar147 + fVar248 * fVar158;
      fVar133 = fVar173;
      if (fVar173 <= fVar148) {
        fVar133 = fVar148;
        fVar148 = fVar173;
      }
      auVar258._8_8_ = auVar257._8_8_;
      auVar258._0_8_ = auVar258._8_8_;
      auVar95._8_4_ = auVar227._8_4_;
      auVar95._0_8_ = auVar227._0_8_;
      auVar95._12_4_ = auVar227._12_4_;
      if (fVar134 <= fVar246) {
        auVar95._0_4_ = fVar134;
      }
      if (auVar95._0_4_ <= fVar148) {
        fVar148 = auVar95._0_4_;
      }
      auVar27._4_8_ = auVar95._8_8_;
      auVar27._0_4_ = fVar147 * fVar149 + fVar158 * fVar149;
      auVar96._0_8_ = auVar27._0_8_ << 0x20;
      auVar96._8_4_ = fVar247;
      auVar96._12_4_ = fVar147 * fVar160 + fVar158 * fVar160;
      if (fVar134 <= fVar246) {
        fVar134 = fVar246;
      }
      auVar97._8_8_ = auVar96._8_8_;
      auVar97._0_8_ = auVar97._8_8_;
      if (fVar134 <= fVar133) {
        fVar134 = fVar133;
      }
      if (fVar176 <= fVar69) {
        auVar258._0_4_ = fVar69;
        fVar69 = fVar176;
      }
      auVar127._8_4_ = auVar227._8_4_;
      auVar127._0_8_ = auVar227._8_8_;
      auVar127._12_4_ = auVar227._12_4_;
      if (fVar247 <= auVar227._8_4_) {
        auVar127._0_4_ = fVar247;
      }
      if (auVar127._0_4_ <= fVar69) {
        fVar69 = auVar127._0_4_;
      }
      if (fVar247 <= auVar227._8_4_) {
        auVar97._0_4_ = auVar227._8_4_;
      }
      if (auVar97._0_4_ <= auVar258._0_4_) {
        auVar97._0_4_ = auVar258._0_4_;
      }
      bVar61 = 3 < (uint)uVar60;
      uVar28 = (undefined3)(uVar66 >> 8);
      fVar133 = auVar97._0_4_;
      if ((0.0001 <= fVar148) || (fVar133 <= -0.0001)) break;
      goto LAB_00b4feb8;
    }
  } while( true );
  if ((fVar69 < 0.0001 && -0.0001 < fVar134) ||
     ((fVar148 < 0.0001 && -0.0001 < fVar134 ||
      (paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar28,bVar61),
      auVar92 = _local_418, fVar69 < 0.0001 && -0.0001 < fVar133)))) {
LAB_00b4feb8:
    _local_348 = auVar319;
    local_418 = (undefined1  [8])auVar240._8_8_;
    auVar92 = _local_418;
    bVar61 = bVar61 || fVar109 < 0.001;
    paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar28,bVar61);
    fVar158 = (float)(~-(uint)(fVar148 < 0.0) & 0x3f800000 | -(uint)(fVar148 < 0.0) & 0xbf800000);
    fVar173 = (float)(~-(uint)(fVar134 < 0.0) & 0x3f800000 | -(uint)(fVar134 < 0.0) & 0xbf800000);
    fVar147 = 0.0;
    if ((fVar158 == fVar173) && (!NAN(fVar158) && !NAN(fVar173))) {
      fVar147 = INFINITY;
    }
    fVar176 = 0.0;
    if ((fVar158 == fVar173) && (!NAN(fVar158) && !NAN(fVar173))) {
      fVar176 = -INFINITY;
    }
    fVar246 = (float)(~-(uint)(fVar69 < 0.0) & 0x3f800000 | -(uint)(fVar69 < 0.0) & 0xbf800000);
    if ((fVar158 != fVar246) || (fVar247 = fVar176, NAN(fVar158) || NAN(fVar246))) {
      if ((fVar69 != fVar148) || (NAN(fVar69) || NAN(fVar148))) {
        fVar69 = -fVar148 / (fVar69 - fVar148);
        fVar69 = (1.0 - fVar69) * 0.0 + fVar69;
        fVar247 = fVar69;
      }
      else {
        fVar69 = 0.0;
        if ((fVar148 != 0.0) || (fVar247 = 1.0, NAN(fVar148))) {
          fVar69 = INFINITY;
          fVar247 = -INFINITY;
        }
      }
      if (fVar69 <= fVar147) {
        fVar147 = fVar69;
      }
      if (fVar247 <= fVar176) {
        fVar247 = fVar176;
      }
    }
    fVar148 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar133 < 0.0) * 4);
    if ((fVar173 != fVar148) || (fVar69 = fVar247, NAN(fVar173) || NAN(fVar148))) {
      if ((fVar133 != fVar134) || (NAN(fVar133) || NAN(fVar134))) {
        fVar158 = -fVar134 / (fVar133 - fVar134);
        fVar158 = (1.0 - fVar158) * 0.0 + fVar158;
        fVar69 = fVar158;
      }
      else {
        fVar158 = 0.0;
        if ((fVar134 != 0.0) || (fVar69 = 1.0, NAN(fVar134))) {
          fVar158 = INFINITY;
          fVar69 = -INFINITY;
        }
      }
      if (fVar158 <= fVar147) {
        fVar147 = fVar158;
      }
      if (fVar69 <= fVar247) {
        fVar69 = fVar247;
      }
    }
    if ((fVar246 != fVar148) || (NAN(fVar246) || NAN(fVar148))) {
      fVar147 = (float)(~-(uint)(fVar147 < 1.0) & 0x3f800000 |
                       (uint)fVar147 & -(uint)(fVar147 < 1.0));
      fVar69 = (float)(~-(uint)(fVar69 < 1.0) & (uint)fVar69 | -(uint)(fVar69 < 1.0) & 0x3f800000);
    }
    fStack_410 = auVar70._8_4_;
    fStack_40c = auVar70._12_4_;
    fVar147 = (float)(~-(uint)(fVar147 < 0.0) & (uint)fVar147);
    fVar148 = (float)(~-(uint)(fVar69 < 1.0) & 0x3f800000 | (uint)fVar69 & -(uint)(fVar69 < 1.0));
    if (fVar147 <= fVar148) {
      fVar147 = fVar147 + -0.1;
      fVar148 = fVar148 + 0.1;
      uVar66 = -(uint)(fVar148 < 1.0);
      fVar147 = (float)(~-(uint)(fVar147 < 0.0) & (uint)fVar147);
      fVar69 = (float)(~uVar66 & 0x3f800000 | (uint)fVar148 & uVar66);
      fVar148 = 1.0 - fVar147;
      fVar266 = 1.0 - fVar147;
      fVar278 = 1.0 - fVar69;
      fVar281 = 1.0 - fVar69;
      fVar134 = auVar145._0_4_ * fVar148 + auVar145._8_4_ * fVar147;
      fVar158 = auVar145._4_4_ * fVar266 + auVar145._12_4_ * fVar147;
      fVar173 = auVar145._0_4_ * fVar278 + auVar145._8_4_ * fVar69;
      fVar176 = auVar145._4_4_ * fVar281 + auVar145._12_4_ * fVar69;
      fVar246 = fVar218 * fVar148 + fVar234 * fVar147;
      fVar247 = fVar232 * fVar266 + fVar248 * fVar147;
      fVar218 = fVar218 * fVar278 + fVar234 * fVar69;
      fVar232 = fVar232 * fVar281 + fVar248 * fVar69;
      fVar234 = fVar261 * fVar148 + fVar315 * fVar147;
      fVar248 = fVar263 * fVar266 + fVar237 * fVar147;
      fVar261 = fVar261 * fVar278 + fVar315 * fVar69;
      fVar263 = fVar263 * fVar281 + fVar237 * fVar69;
      fVar315 = fVar148 * fVar135 + fVar159 * fVar147;
      fVar237 = fVar266 * fVar149 + fVar160 * fVar147;
      fVar135 = fVar278 * fVar135 + fStack_410 * fVar69;
      fVar149 = fVar281 * fVar149 + fStack_40c * fVar69;
      fVar148 = fVar159 * (1.0 - fVar147) + fVar160 * fVar147;
      fVar69 = fVar159 * (1.0 - fVar69) + fVar160 * fVar69;
      fVar109 = 1.0 / fVar109;
      auVar128._0_4_ = fVar135 - fVar315;
      auVar128._4_4_ = fVar149 - fVar237;
      auVar128._8_4_ = fVar135 - fVar135;
      auVar128._12_4_ = fVar149 - fVar149;
      auVar156._0_8_ = CONCAT44(fVar263 - fVar248,fVar261 - fVar234);
      auVar156._8_4_ = fVar261 - fVar261;
      auVar156._12_4_ = fVar263 - fVar263;
      auVar203._0_4_ = fVar218 - fVar246;
      auVar203._4_4_ = fVar232 - fVar247;
      auVar203._8_4_ = fVar218 - fVar218;
      auVar203._12_4_ = fVar232 - fVar232;
      auVar259._0_8_ = CONCAT44((fVar247 - fVar158) * 3.0,(fVar246 - fVar134) * 3.0);
      auVar259._8_4_ = (fVar218 - fVar173) * 3.0;
      auVar259._12_4_ = (fVar232 - fVar176) * 3.0;
      auVar169._0_8_ = CONCAT44((fVar248 - fVar247) * 3.0,(fVar234 - fVar246) * 3.0);
      auVar169._8_4_ = (fVar261 - fVar218) * 3.0;
      auVar169._12_4_ = (fVar263 - fVar232) * 3.0;
      auVar293._0_4_ = (fVar315 - fVar234) * 3.0;
      auVar293._4_4_ = (fVar237 - fVar248) * 3.0;
      auVar293._8_4_ = (fVar135 - fVar261) * 3.0;
      auVar293._12_4_ = (fVar149 - fVar263) * 3.0;
      auVar228._8_4_ = auVar169._8_4_;
      auVar228._0_8_ = auVar169._0_8_;
      auVar228._12_4_ = auVar169._12_4_;
      auVar137 = minps(auVar228,auVar293);
      auVar70 = maxps(auVar169,auVar293);
      auVar274._8_4_ = auVar259._8_4_;
      auVar274._0_8_ = auVar259._0_8_;
      auVar274._12_4_ = auVar259._12_4_;
      auVar139 = minps(auVar274,auVar137);
      auVar123 = maxps(auVar259,auVar70);
      auVar29._4_8_ = auVar70._8_8_;
      auVar29._0_4_ = auVar139._4_4_;
      auVar170._0_8_ = auVar29._0_8_ << 0x20;
      auVar170._8_4_ = auVar139._8_4_;
      auVar170._12_4_ = auVar139._12_4_;
      auVar171._8_8_ = auVar139._8_8_;
      auVar171._0_8_ = auVar170._8_8_;
      auVar30._4_8_ = auVar137._8_8_;
      auVar30._0_4_ = auVar123._4_4_;
      auVar229._0_8_ = auVar30._0_8_ << 0x20;
      auVar229._8_4_ = auVar123._8_4_;
      auVar229._12_4_ = auVar123._12_4_;
      auVar230._8_8_ = auVar123._8_8_;
      auVar230._0_8_ = auVar229._8_8_;
      auVar137 = minps(auVar139,auVar171);
      auVar70 = maxps(auVar123,auVar230);
      fVar312 = auVar137._0_4_ * fVar109;
      fVar313 = auVar137._4_4_ * fVar109;
      fVar314 = auVar137._8_4_ * fVar109;
      fVar316 = auVar137._12_4_ * fVar109;
      fVar263 = fVar109 * auVar70._0_4_;
      fVar237 = fVar109 * auVar70._4_4_;
      fVar247 = fVar109 * auVar70._8_4_;
      fVar109 = fVar109 * auVar70._12_4_;
      fVar299 = 1.0 / (fVar69 - fVar148);
      auVar98._0_8_ = CONCAT44(fVar176 - fVar158,fVar173 - fVar134);
      auVar98._8_4_ = fVar173 - fVar173;
      auVar98._12_4_ = fVar176 - fVar176;
      auVar241._8_4_ = auVar98._8_4_;
      auVar241._0_8_ = auVar98._0_8_;
      auVar241._12_4_ = auVar98._12_4_;
      auVar123 = minps(auVar241,auVar203);
      auVar70 = maxps(auVar98,auVar203);
      auVar146._8_4_ = auVar156._8_4_;
      auVar146._0_8_ = auVar156._0_8_;
      auVar146._12_4_ = auVar156._12_4_;
      auVar137 = minps(auVar146,auVar128);
      auVar123 = minps(auVar123,auVar137);
      auVar137 = maxps(auVar156,auVar128);
      auVar70 = maxps(auVar70,auVar137);
      fVar281 = auVar123._0_4_ * fVar299;
      fVar286 = auVar123._4_4_ * fVar299;
      fVar303 = fVar299 * auVar70._0_4_;
      fVar299 = fVar299 * auVar70._4_4_;
      local_418._4_4_ = fVar148;
      local_418._0_4_ = fVar107;
      fStack_410 = fVar108;
      fStack_40c = fVar69;
      auVar231._4_4_ = fVar69;
      auVar231._0_4_ = fVar108;
      auVar231._8_4_ = fStack_3b0;
      auVar231._12_4_ = fStack_3ac;
      fVar176 = (fVar107 + fVar108) * 0.5;
      fVar218 = (fVar148 + fVar69) * 0.5;
      fVar232 = (fVar108 + fStack_3b0) * 0.0;
      fVar234 = (fVar69 + fStack_3ac) * 0.0;
      fVar134 = local_88 * fVar176 + (float)local_1f8;
      fVar135 = fStack_84 * fVar176 + local_1f8._4_4_;
      fVar147 = fStack_80 * fVar176 + fStack_1f0;
      fVar149 = fStack_7c * fVar176 + fStack_1ec;
      fVar158 = local_98 * fVar176 + fVar210;
      fVar159 = fStack_94 * fVar176 + fVar213;
      fVar160 = fStack_90 * fVar176 + fVar181;
      fVar173 = fStack_8c * fVar176 + fVar208;
      fVar134 = (fVar158 - fVar134) * fVar176 + fVar134;
      fVar135 = (fVar159 - fVar135) * fVar176 + fVar135;
      fVar147 = (fVar160 - fVar147) * fVar176 + fVar147;
      fVar149 = (fVar173 - fVar149) * fVar176 + fVar149;
      fVar158 = (((local_a8 * fVar176 + fVar216) - fVar158) * fVar176 + fVar158) - fVar134;
      fVar159 = (((fStack_a4 * fVar176 + fVar217) - fVar159) * fVar176 + fVar159) - fVar135;
      fVar160 = (((fStack_a0 * fVar176 + fVar297) - fVar160) * fVar176 + fVar160) - fVar147;
      fVar173 = (((fStack_9c * fVar176 + fVar301) - fVar173) * fVar176 + fVar173) - fVar149;
      fVar134 = fVar176 * fVar158 + fVar134;
      fVar135 = fVar176 * fVar159 + fVar135;
      fVar158 = fVar158 * 3.0;
      fVar159 = fVar159 * 3.0;
      fVar147 = (fVar176 * fVar160 + fVar147) - fVar134;
      fVar149 = (fVar176 * fVar173 + fVar149) - fVar135;
      fVar158 = (fVar160 * 3.0 - fVar158) * fVar218 + fVar158;
      fVar159 = (fVar173 * 3.0 - fVar159) * fVar218 + fVar159;
      auVar157._0_8_ = CONCAT44(fVar158,fVar147) ^ 0x80000000;
      auVar157._8_4_ = fVar158;
      auVar157._12_4_ = fVar158;
      fVar321 = fVar107 - fVar176;
      fVar323 = fVar148 - fVar218;
      fVar325 = fVar108 - fVar232;
      fVar287 = fVar69 - fVar234;
      fVar298 = fVar108 - fVar176;
      fVar300 = fVar69 - fVar218;
      fVar232 = fStack_3b0 - fVar232;
      fVar234 = fStack_3ac - fVar234;
      fVar134 = fVar147 * fVar218 + fVar134;
      fVar135 = fVar149 * fVar218 + fVar135;
      auVar172._0_8_ = CONCAT44(fVar159,fVar149) ^ 0x8000000000000000;
      auVar172._8_4_ = -fVar159;
      auVar172._12_4_ = -fVar159;
      auVar99._0_4_ = fVar149 * fVar158 - fVar159 * fVar147;
      auVar99._4_4_ = auVar99._0_4_;
      auVar99._8_4_ = auVar99._0_4_;
      auVar99._12_4_ = auVar99._0_4_;
      auVar137 = divps(auVar172,auVar99);
      auVar70 = divps(auVar157,auVar99);
      fVar248 = auVar137._0_4_;
      fVar261 = auVar137._4_4_;
      fVar160 = auVar70._0_4_;
      fVar173 = auVar70._4_4_;
      fVar176 = fVar176 - (fVar135 * fVar160 + fVar134 * fVar248);
      fVar158 = fVar218 - (fVar135 * fVar173 + fVar134 * fVar261);
      fVar159 = fVar218 - (fVar135 * auVar70._8_4_ + fVar134 * auVar137._8_4_);
      fVar218 = fVar218 - (fVar135 * auVar70._12_4_ + fVar134 * auVar137._12_4_);
      auVar129._0_8_ = CONCAT44(fVar261 * fVar281,fVar261 * fVar312);
      auVar129._8_4_ = fVar261 * fVar313;
      auVar129._12_4_ = fVar261 * fVar286;
      auVar100._0_4_ = fVar261 * fVar263;
      auVar100._4_4_ = fVar261 * fVar303;
      auVar100._8_4_ = fVar261 * fVar237;
      auVar100._12_4_ = fVar261 * fVar299;
      auVar330._8_4_ = auVar129._8_4_;
      auVar330._0_8_ = auVar129._0_8_;
      auVar330._12_4_ = auVar129._12_4_;
      auVar139 = minps(auVar330,auVar100);
      auVar70 = maxps(auVar100,auVar129);
      auVar204._0_8_ = CONCAT44(fVar173 * fVar286,fVar173 * fVar313);
      auVar204._8_4_ = fVar173 * fVar314;
      auVar204._12_4_ = fVar173 * fVar316;
      auVar130._0_4_ = fVar173 * fVar237;
      auVar130._4_4_ = fVar173 * fVar299;
      auVar130._8_4_ = fVar173 * fVar247;
      auVar130._12_4_ = fVar173 * fVar109;
      auVar275._8_4_ = auVar204._8_4_;
      auVar275._0_8_ = auVar204._0_8_;
      auVar275._12_4_ = auVar204._12_4_;
      auVar123 = minps(auVar275,auVar130);
      auVar137 = maxps(auVar130,auVar204);
      fVar134 = 0.0 - (auVar137._0_4_ + auVar70._0_4_);
      fVar135 = 1.0 - (auVar137._4_4_ + auVar70._4_4_);
      fVar147 = 0.0 - (auVar137._8_4_ + auVar70._8_4_);
      fVar149 = 0.0 - (auVar137._12_4_ + auVar70._12_4_);
      fVar315 = 0.0 - (auVar123._0_4_ + auVar139._0_4_);
      fVar246 = 1.0 - (auVar123._4_4_ + auVar139._4_4_);
      fVar266 = 0.0 - (auVar123._8_4_ + auVar139._8_4_);
      fVar278 = 0.0 - (auVar123._12_4_ + auVar139._12_4_);
      auVar131._0_8_ = CONCAT44(fVar323 * fVar135,fVar321 * fVar134);
      auVar131._8_4_ = fVar325 * fVar147;
      auVar131._12_4_ = fVar287 * fVar149;
      auVar294._0_8_ = CONCAT44(fVar281 * fVar248,fVar312 * fVar248);
      auVar294._8_4_ = fVar313 * fVar248;
      auVar294._12_4_ = fVar286 * fVar248;
      auVar205._0_4_ = fVar248 * fVar263;
      auVar205._4_4_ = fVar248 * fVar303;
      auVar205._8_4_ = fVar248 * fVar237;
      auVar205._12_4_ = fVar248 * fVar299;
      auVar276._8_4_ = auVar294._8_4_;
      auVar276._0_8_ = auVar294._0_8_;
      auVar276._12_4_ = auVar294._12_4_;
      auVar137 = minps(auVar276,auVar205);
      auVar70 = maxps(auVar205,auVar294);
      auVar242._0_8_ = CONCAT44(fVar286 * fVar160,fVar313 * fVar160);
      auVar242._8_4_ = fVar314 * fVar160;
      auVar242._12_4_ = fVar316 * fVar160;
      auVar295._0_4_ = fVar160 * fVar237;
      auVar295._4_4_ = fVar160 * fVar299;
      auVar295._8_4_ = fVar160 * fVar247;
      auVar295._12_4_ = fVar160 * fVar109;
      auVar329._8_4_ = auVar242._8_4_;
      auVar329._0_8_ = auVar242._0_8_;
      auVar329._12_4_ = auVar242._12_4_;
      auVar139 = minps(auVar329,auVar295);
      auVar277._0_4_ = fVar321 * fVar315;
      auVar277._4_4_ = fVar323 * fVar246;
      auVar277._8_4_ = fVar325 * fVar266;
      auVar277._12_4_ = fVar287 * fVar278;
      auVar101._0_8_ = CONCAT44(fVar135 * fVar300,fVar134 * fVar298);
      auVar101._8_4_ = fVar147 * fVar232;
      auVar101._12_4_ = fVar149 * fVar234;
      auVar215._0_4_ = fVar315 * fVar298;
      auVar215._4_4_ = fVar246 * fVar300;
      auVar215._8_4_ = fVar266 * fVar232;
      auVar215._12_4_ = fVar278 * fVar234;
      auVar123 = maxps(auVar295,auVar242);
      fVar109 = 1.0 - (auVar123._0_4_ + auVar70._0_4_);
      fVar134 = 0.0 - (auVar123._4_4_ + auVar70._4_4_);
      fVar135 = 0.0 - (auVar123._8_4_ + auVar70._8_4_);
      fVar147 = 0.0 - (auVar123._12_4_ + auVar70._12_4_);
      fVar149 = 1.0 - (auVar139._0_4_ + auVar137._0_4_);
      fVar263 = 0.0 - (auVar139._4_4_ + auVar137._4_4_);
      fVar315 = 0.0 - (auVar139._8_4_ + auVar137._8_4_);
      fVar237 = 0.0 - (auVar139._12_4_ + auVar137._12_4_);
      auVar243._0_8_ = CONCAT44(fVar323 * fVar134,fVar321 * fVar109);
      auVar243._8_4_ = fVar325 * fVar135;
      auVar243._12_4_ = fVar287 * fVar147;
      auVar311._0_4_ = fVar321 * fVar149;
      auVar311._4_4_ = fVar323 * fVar263;
      auVar311._8_4_ = fVar325 * fVar315;
      auVar311._12_4_ = fVar287 * fVar237;
      auVar206._0_8_ = CONCAT44(fVar134 * fVar300,fVar109 * fVar298);
      auVar206._8_4_ = fVar135 * fVar232;
      auVar206._12_4_ = fVar147 * fVar234;
      auVar260._0_4_ = fVar149 * fVar298;
      auVar260._4_4_ = fVar263 * fVar300;
      auVar260._8_4_ = fVar315 * fVar232;
      auVar260._12_4_ = fVar237 * fVar234;
      auVar296._8_4_ = auVar243._8_4_;
      auVar296._0_8_ = auVar243._0_8_;
      auVar296._12_4_ = auVar243._12_4_;
      auVar70 = minps(auVar296,auVar311);
      auVar320._8_4_ = auVar206._8_4_;
      auVar320._0_8_ = auVar206._0_8_;
      auVar320._12_4_ = auVar206._12_4_;
      auVar137 = minps(auVar320,auVar260);
      auVar255 = minps(auVar70,auVar137);
      auVar137 = maxps(auVar311,auVar243);
      auVar70 = maxps(auVar260,auVar206);
      auVar123 = maxps(auVar70,auVar137);
      auVar244._8_4_ = auVar131._8_4_;
      auVar244._0_8_ = auVar131._0_8_;
      auVar244._12_4_ = auVar131._12_4_;
      auVar137 = minps(auVar244,auVar277);
      auVar207._8_4_ = auVar101._8_4_;
      auVar207._0_8_ = auVar101._0_8_;
      auVar207._12_4_ = auVar101._12_4_;
      auVar70 = minps(auVar207,auVar215);
      auVar137 = minps(auVar137,auVar70);
      auVar139 = maxps(auVar277,auVar131);
      auVar70 = maxps(auVar215,auVar101);
      auVar70 = maxps(auVar70,auVar139);
      auVar245._0_4_ = auVar255._4_4_ + auVar255._0_4_ + fVar176;
      auVar245._4_4_ = auVar137._4_4_ + auVar137._0_4_ + fVar158;
      auVar245._8_4_ = auVar255._8_4_ + auVar255._4_4_ + fVar159;
      auVar245._12_4_ = auVar255._12_4_ + auVar137._4_4_ + fVar218;
      fVar109 = auVar123._4_4_ + auVar123._0_4_ + fVar176;
      fVar134 = auVar70._4_4_ + auVar70._0_4_ + fVar158;
      auVar102._4_4_ = fVar134;
      auVar102._0_4_ = fVar109;
      auVar137 = maxps(_local_418,auVar245);
      auVar102._8_4_ = auVar123._8_4_ + auVar123._4_4_ + fVar159;
      auVar102._12_4_ = auVar123._12_4_ + auVar70._4_4_ + fVar218;
      auVar70 = minps(auVar102,auVar231);
      iVar63 = -(uint)(auVar70._0_4_ < auVar137._0_4_);
      iVar65 = -(uint)(auVar70._4_4_ < auVar137._4_4_);
      auVar104._4_4_ = iVar65;
      auVar104._0_4_ = iVar63;
      auVar104._8_4_ = iVar65;
      auVar104._12_4_ = iVar65;
      auVar103._8_8_ = auVar104._8_8_;
      auVar103._4_4_ = iVar63;
      auVar103._0_4_ = iVar63;
      iVar63 = movmskpd((uint)(fVar133 < 0.0),auVar103);
      auVar319 = _DAT_01f7b6c0;
      auVar92 = _local_418;
      if (iVar63 == 0) {
        bVar53 = 0;
        if ((fVar107 < auVar245._0_4_) && (fVar109 < fVar108)) {
          bVar53 = -(fVar134 < fVar69) & fVar148 < auVar245._4_4_;
        }
        bVar53 = bVar61 | bVar53;
        uVar55 = (ulong)CONCAT31(uVar28,bVar53);
        if (bVar53 != 1) goto LAB_00b4f4e3;
        paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)&DAT_000000c8;
        do {
          fVar148 = 1.0 - fVar176;
          fVar109 = fVar176 * fVar176 * fVar176;
          fVar108 = fVar176 * fVar176 * 3.0 * fVar148;
          fVar69 = fVar148 * fVar148 * fVar148;
          fVar133 = fVar176 * 3.0 * fVar148 * fVar148;
          fVar107 = fVar69 * (float)local_1f8 +
                    fVar133 * fVar210 + fVar108 * fVar216 + fVar109 * (float)local_328._0_4_;
          fVar148 = fVar69 * local_1f8._4_4_ +
                    fVar133 * fVar213 + fVar108 * fVar217 + fVar109 * (float)local_328._4_4_;
          fVar107 = ((fVar69 * fStack_1f0 +
                     fVar133 * fVar181 + fVar108 * fVar297 + fVar109 * fStack_320) - fVar107) *
                    fVar158 + fVar107;
          fVar148 = ((fVar69 * fStack_1ec +
                     fVar133 * fVar208 + fVar108 * fVar301 + fVar109 * fStack_31c) - fVar148) *
                    fVar158 + fVar148;
          fVar176 = fVar176 - (fVar148 * fVar160 + fVar107 * fVar248);
          fVar158 = fVar158 - (fVar148 * fVar173 + fVar107 * fVar261);
          fVar107 = (float)((uint)fVar107 & (uint)DAT_01f7b6c0);
          fVar148 = (float)((uint)fVar148 & DAT_01f7b6c0._4_4_);
          if (fVar148 <= fVar107) {
            fVar148 = fVar107;
          }
          if (fVar148 < local_338) {
            if ((((fVar176 < 0.0) || (1.0 < fVar176)) || (fVar158 < 0.0)) || (1.0 < fVar158)) break;
            fVar148 = (pre->ray_space).vx.field_0.m128[2];
            fVar69 = (pre->ray_space).vy.field_0.m128[2];
            fVar107 = (pre->ray_space).vz.field_0.m128[2];
            fVar108 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar109 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar133 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar160 = 1.0 - fVar158;
            fVar159 = 1.0 - fVar176;
            fVar134 = fVar159 * fVar159 * fVar159;
            fVar135 = fVar176 * 3.0 * fVar159 * fVar159;
            fVar149 = fVar176 * fVar176 * fVar176;
            fVar147 = fVar176 * fVar176 * 3.0 * fVar159;
            fVar148 = (((fStack_370 - fVar133) * fVar107 +
                       (fStack_374 - fVar109) * fVar69 + (local_378 - fVar108) * fVar148) * fVar160
                      + ((fStack_360 - fVar133) * fVar107 +
                        (fStack_364 - fVar109) * fVar69 + (local_368 - fVar108) * fVar148) * fVar158
                      ) * fVar134 +
                      (((fStack_380 - fVar133) * fVar107 +
                       (fStack_384 - fVar109) * fVar69 + (local_388 - fVar108) * fVar148) * fVar160
                      + ((fStack_350 - fVar133) * fVar107 +
                        (fStack_354 - fVar109) * fVar69 + (local_358 - fVar108) * fVar148) * fVar158
                      ) * fVar135 +
                      (((fStack_3a0 - fVar133) * fVar107 +
                       (fStack_3a4 - fVar109) * fVar69 + (local_3a8 - fVar108) * fVar148) * fVar160
                      + ((local_3cc.m128[3] - fVar133) * fVar107 +
                        (local_3cc.m128[2] - fVar109) * fVar69 +
                        (local_3cc.m128[1] - fVar108) * fVar148) * fVar158) * fVar147 +
                      (fVar160 * ((fStack_390 - fVar133) * fVar107 +
                                 (fStack_394 - fVar109) * fVar69 + (local_398 - fVar108) * fVar148)
                      + ((fStack_200 - fVar133) * fVar107 +
                        (fStack_204 - fVar109) * fVar69 + (local_208 - fVar108) * fVar148) * fVar158
                      ) * fVar149;
            if (fVar148 < (ray->super_RayK<1>).org.field_0.m128[3]) break;
            fVar69 = (ray->super_RayK<1>).tfar;
            auVar319 = ZEXT416((uint)fVar69);
            if (fVar69 < fVar148) break;
            fVar133 = 1.0 - fVar158;
            fVar160 = 1.0 - fVar158;
            fVar173 = 1.0 - fVar158;
            fVar107 = local_388 * fVar133 + local_358 * fVar158;
            fVar108 = fStack_384 * fVar160 + fStack_354 * fVar158;
            fVar109 = fStack_380 * fVar173 + fStack_350 * fVar158;
            fVar218 = local_3a8 * fVar133 + local_3cc.m128[1] * fVar158;
            fVar234 = fStack_3a4 * fVar160 + local_3cc.m128[2] * fVar158;
            fVar261 = fStack_3a0 * fVar173 + local_3cc.m128[3] * fVar158;
            fVar232 = fVar218 - fVar107;
            fVar248 = fVar234 - fVar108;
            fVar263 = fVar261 - fVar109;
            fVar107 = (((fVar107 - (local_378 * fVar133 + local_368 * fVar158)) * fVar159 +
                       fVar176 * fVar232) * fVar159 +
                      (fVar232 * fVar159 +
                      ((fVar133 * local_398 + fVar158 * local_208) - fVar218) * fVar176) * fVar176)
                      * 3.0;
            fVar108 = (((fVar108 - (fStack_374 * fVar160 + fStack_364 * fVar158)) * fVar159 +
                       fVar176 * fVar248) * fVar159 +
                      (fVar248 * fVar159 +
                      ((fVar160 * fStack_394 + fVar158 * fStack_204) - fVar234) * fVar176) * fVar176
                      ) * 3.0;
            fVar109 = (((fVar109 - (fStack_370 * fVar173 + fStack_360 * fVar158)) * fVar159 +
                       fVar176 * fVar263) * fVar159 +
                      (fVar263 * fVar159 +
                      ((fVar173 * fStack_390 + fVar158 * fStack_200) - fVar261) * fVar176) * fVar176
                      ) * 3.0;
            pGVar16 = (context->scene->geometries).items[uVar64].ptr;
            uVar66 = (ray->super_RayK<1>).mask;
            paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar66;
            if ((pGVar16->mask & uVar66) == 0) break;
            fVar159 = fVar134 * local_168 +
                      fVar135 * local_178 + fVar147 * local_188 + fVar149 * local_198;
            fVar160 = fVar134 * fStack_164 +
                      fVar135 * fStack_174 + fVar147 * fStack_184 + fVar149 * fStack_194;
            fVar134 = fVar134 * fStack_160 +
                      fVar135 * fStack_170 + fVar147 * fStack_180 + fVar149 * fStack_190;
            fVar133 = fVar160 * fVar107 - fVar108 * fVar159;
            uVar150 = CONCAT44(fVar159 * fVar109 - fVar107 * fVar134,
                               fVar134 * fVar108 - fVar109 * fVar160);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              (ray->super_RayK<1>).tfar = fVar148;
              *(undefined8 *)&(ray->Ng).field_0 = uVar150;
              (ray->Ng).field_0.field_0.z = fVar133;
              ray->u = fVar176;
              ray->v = fVar158;
              ray->primID = (uint)local_310;
              ray->geomID = uVar64;
              ray->instID[0] = context->user->instID[0];
              uVar66 = context->user->instPrimID[0];
              ray->instPrimID[0] = uVar66;
              paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar66;
              break;
            }
            local_1d8 = uVar150;
            local_1d0 = fVar133;
            local_1cc = fVar176;
            fStack_1c8 = fVar158;
            local_1c4 = (uint)local_310;
            local_1c0 = uVar64;
            local_1bc = context->user->instID[0];
            local_1b8 = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = fVar148;
            local_3cc.m128[0] = -NAN;
            local_278.valid = (int *)&local_3cc;
            local_278.geometryUserPtr = pGVar16->userPtr;
            local_278.context = context->user;
            local_278.ray = (RTCRayN *)ray;
            local_278.hit = (RTCHitN *)&local_1d8;
            local_278.N = 1;
            if ((pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               (local_3b8 = lVar59, (*pGVar16->intersectionFilterN)(&local_278), lVar59 = local_3b8,
               *(float *)local_278.valid != 0.0)) {
              p_Var21 = context->args->filter;
              if ((p_Var21 == (RTCFilterFunctionN)0x0) ||
                 ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                    RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar16->field_8).field_0x2 & 0x40) == 0))
                  || ((*p_Var21)(&local_278), *(float *)local_278.valid != 0.0)))) {
                *(float *)((long)local_278.ray + 0x30) = *(float *)local_278.hit;
                *(float *)((long)local_278.ray + 0x34) = *(float *)(local_278.hit + 4);
                *(float *)((long)local_278.ray + 0x38) = *(float *)(local_278.hit + 8);
                *(float *)((long)local_278.ray + 0x3c) = *(float *)(local_278.hit + 0xc);
                *(float *)((long)local_278.ray + 0x40) = *(float *)(local_278.hit + 0x10);
                *(float *)((long)local_278.ray + 0x44) = *(float *)(local_278.hit + 0x14);
                *(float *)((long)local_278.ray + 0x48) = *(float *)(local_278.hit + 0x18);
                *(float *)((long)local_278.ray + 0x4c) = *(float *)(local_278.hit + 0x1c);
                *(float *)((long)local_278.ray + 0x50) = *(float *)(local_278.hit + 0x20);
                paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_278.ray;
                break;
              }
            }
            (ray->super_RayK<1>).tfar = fVar69;
            paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_278.valid;
            break;
          }
          paVar56 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar56 + -1);
        } while (paVar56 != (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0);
      }
    }
  }
  goto LAB_00b4fb50;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }